

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  byte bVar59;
  ulong uVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  long lVar65;
  long lVar66;
  undefined1 uVar67;
  bool bVar68;
  undefined1 uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar125;
  uint uVar126;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar128;
  uint uVar129;
  uint uVar130;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  uint uVar127;
  uint uVar131;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar132;
  vint4 bi_2;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  vint4 bi_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  vint4 bi;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  vint4 ai_2;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  vint4 ai_1;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined4 uVar221;
  float fVar222;
  float fVar231;
  float fVar232;
  vint4 ai;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar230 [32];
  float fVar237;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar244;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar245 [28];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined4 uVar254;
  undefined4 uVar255;
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_9bd;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  undefined8 local_910;
  undefined8 uStack_908;
  uint local_8f4;
  uint local_8f0;
  undefined4 local_8ec;
  float local_8e8;
  float local_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  ulong local_708;
  ulong local_700;
  ulong local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 auStack_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  Primitive *local_590;
  ulong local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar256 [16];
  
  PVar2 = prim[1];
  uVar60 = (ulong)(byte)PVar2;
  lVar66 = uVar60 * 0x25;
  fVar132 = *(float *)(prim + lVar66 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar76 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar66 + 6));
  auVar198._0_4_ = fVar132 * auVar76._0_4_;
  auVar198._4_4_ = fVar132 * auVar76._4_4_;
  auVar198._8_4_ = fVar132 * auVar76._8_4_;
  auVar198._12_4_ = fVar132 * auVar76._12_4_;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar133._0_4_ = fVar132 * auVar75._0_4_;
  auVar133._4_4_ = fVar132 * auVar75._4_4_;
  auVar133._8_4_ = fVar132 * auVar75._8_4_;
  auVar133._12_4_ = fVar132 * auVar75._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar60 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar214._4_4_ = auVar133._0_4_;
  auVar214._0_4_ = auVar133._0_4_;
  auVar214._8_4_ = auVar133._0_4_;
  auVar214._12_4_ = auVar133._0_4_;
  auVar83 = vshufps_avx(auVar133,auVar133,0x55);
  auVar82 = vshufps_avx(auVar133,auVar133,0xaa);
  fVar132 = auVar82._0_4_;
  auVar176._0_4_ = fVar132 * auVar78._0_4_;
  fVar222 = auVar82._4_4_;
  auVar176._4_4_ = fVar222 * auVar78._4_4_;
  fVar231 = auVar82._8_4_;
  auVar176._8_4_ = fVar231 * auVar78._8_4_;
  fVar232 = auVar82._12_4_;
  auVar176._12_4_ = fVar232 * auVar78._12_4_;
  auVar155._0_4_ = auVar84._0_4_ * fVar132;
  auVar155._4_4_ = auVar84._4_4_ * fVar222;
  auVar155._8_4_ = auVar84._8_4_ * fVar231;
  auVar155._12_4_ = auVar84._12_4_ * fVar232;
  auVar134._0_4_ = auVar81._0_4_ * fVar132;
  auVar134._4_4_ = auVar81._4_4_ * fVar222;
  auVar134._8_4_ = auVar81._8_4_ * fVar231;
  auVar134._12_4_ = auVar81._12_4_ * fVar232;
  auVar82 = vfmadd231ps_fma(auVar176,auVar83,auVar75);
  auVar20 = vfmadd231ps_fma(auVar155,auVar83,auVar85);
  auVar83 = vfmadd231ps_fma(auVar134,auVar77,auVar83);
  auVar21 = vfmadd231ps_fma(auVar82,auVar214,auVar76);
  auVar20 = vfmadd231ps_fma(auVar20,auVar214,auVar79);
  auVar22 = vfmadd231ps_fma(auVar83,auVar80,auVar214);
  auVar256._4_4_ = auVar198._0_4_;
  auVar256._0_4_ = auVar198._0_4_;
  auVar256._8_4_ = auVar198._0_4_;
  auVar256._12_4_ = auVar198._0_4_;
  auVar257 = ZEXT1664(auVar256);
  auVar83 = vshufps_avx(auVar198,auVar198,0x55);
  auVar82 = vshufps_avx(auVar198,auVar198,0xaa);
  fVar132 = auVar82._0_4_;
  auVar215._0_4_ = fVar132 * auVar78._0_4_;
  fVar222 = auVar82._4_4_;
  auVar215._4_4_ = fVar222 * auVar78._4_4_;
  fVar231 = auVar82._8_4_;
  auVar215._8_4_ = fVar231 * auVar78._8_4_;
  fVar232 = auVar82._12_4_;
  auVar215._12_4_ = fVar232 * auVar78._12_4_;
  auVar206._0_4_ = auVar84._0_4_ * fVar132;
  auVar206._4_4_ = auVar84._4_4_ * fVar222;
  auVar206._8_4_ = auVar84._8_4_ * fVar231;
  auVar206._12_4_ = auVar84._12_4_ * fVar232;
  auVar199._0_4_ = auVar81._0_4_ * fVar132;
  auVar199._4_4_ = auVar81._4_4_ * fVar222;
  auVar199._8_4_ = auVar81._8_4_ * fVar231;
  auVar199._12_4_ = auVar81._12_4_ * fVar232;
  auVar75 = vfmadd231ps_fma(auVar215,auVar83,auVar75);
  auVar78 = vfmadd231ps_fma(auVar206,auVar83,auVar85);
  auVar85 = vfmadd231ps_fma(auVar199,auVar83,auVar77);
  auVar23 = vfmadd231ps_fma(auVar75,auVar256,auVar76);
  auVar133 = vfmadd231ps_fma(auVar78,auVar256,auVar79);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar134 = vfmadd231ps_fma(auVar85,auVar256,auVar80);
  auVar76 = vandps_avx(auVar242,auVar21);
  auVar238._8_4_ = 0x219392ef;
  auVar238._0_8_ = 0x219392ef219392ef;
  auVar238._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar76,auVar238,1);
  bVar68 = (bool)((byte)uVar70 & 1);
  auVar72._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar21._0_4_;
  bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar21._4_4_;
  bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar21._8_4_;
  bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar21._12_4_;
  auVar76 = vandps_avx(auVar242,auVar20);
  uVar70 = vcmpps_avx512vl(auVar76,auVar238,1);
  bVar68 = (bool)((byte)uVar70 & 1);
  auVar73._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar20._0_4_;
  bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar20._4_4_;
  bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar20._8_4_;
  bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar20._12_4_;
  auVar76 = vandps_avx(auVar242,auVar22);
  uVar70 = vcmpps_avx512vl(auVar76,auVar238,1);
  bVar68 = (bool)((byte)uVar70 & 1);
  auVar74._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar22._0_4_;
  bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar22._4_4_;
  bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar22._8_4_;
  bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar22._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar72);
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = &DAT_3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar72,auVar75,auVar239);
  auVar21 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar75,auVar239);
  auVar22 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar76 = vfnmadd213ps_fma(auVar74,auVar75,auVar239);
  auVar19 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  fVar132 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar66 + 0x16)) *
            *(float *)(prim + lVar66 + 0x1a);
  auVar223._4_4_ = fVar132;
  auVar223._0_4_ = fVar132;
  auVar223._8_4_ = fVar132;
  auVar223._12_4_ = fVar132;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar79 = vsubps_avx(auVar75,auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar78 = vfmadd213ps_fma(auVar79,auVar223,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar75);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar75 = vpmovsxwd_avx(auVar79);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar79 = vfmadd213ps_fma(auVar75,auVar223,auVar76);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar76 = vpmovsxwd_avx(auVar85);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar70 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar60 * 2 + uVar70 + 6);
  auVar75 = vpmovsxwd_avx(auVar84);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar85 = vfmadd213ps_fma(auVar75,auVar223,auVar76);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar76 = vpmovsxwd_avx(auVar80);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar84 = vfmadd213ps_fma(auVar75,auVar223,auVar76);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar81);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar75 = vpmovsxwd_avx(auVar83);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar80 = vfmadd213ps_fma(auVar75,auVar223,auVar76);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar60) + 6);
  auVar76 = vpmovsxwd_avx(auVar82);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar75 = vpmovsxwd_avx(auVar20);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar75 = vfmadd213ps_fma(auVar75,auVar223,auVar76);
  auVar76 = vsubps_avx(auVar78,auVar23);
  auVar224._0_4_ = auVar21._0_4_ * auVar76._0_4_;
  auVar224._4_4_ = auVar21._4_4_ * auVar76._4_4_;
  auVar224._8_4_ = auVar21._8_4_ * auVar76._8_4_;
  auVar224._12_4_ = auVar21._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar79,auVar23);
  auVar177._0_4_ = auVar21._0_4_ * auVar76._0_4_;
  auVar177._4_4_ = auVar21._4_4_ * auVar76._4_4_;
  auVar177._8_4_ = auVar21._8_4_ * auVar76._8_4_;
  auVar177._12_4_ = auVar21._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar85,auVar133);
  auVar216._0_4_ = auVar22._0_4_ * auVar76._0_4_;
  auVar216._4_4_ = auVar22._4_4_ * auVar76._4_4_;
  auVar216._8_4_ = auVar22._8_4_ * auVar76._8_4_;
  auVar216._12_4_ = auVar22._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar84,auVar133);
  auVar156._0_4_ = auVar22._0_4_ * auVar76._0_4_;
  auVar156._4_4_ = auVar22._4_4_ * auVar76._4_4_;
  auVar156._8_4_ = auVar22._8_4_ * auVar76._8_4_;
  auVar156._12_4_ = auVar22._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar80,auVar134);
  auVar207._0_4_ = auVar19._0_4_ * auVar76._0_4_;
  auVar207._4_4_ = auVar19._4_4_ * auVar76._4_4_;
  auVar207._8_4_ = auVar19._8_4_ * auVar76._8_4_;
  auVar207._12_4_ = auVar19._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar75,auVar134);
  auVar135._0_4_ = auVar19._0_4_ * auVar76._0_4_;
  auVar135._4_4_ = auVar19._4_4_ * auVar76._4_4_;
  auVar135._8_4_ = auVar19._8_4_ * auVar76._8_4_;
  auVar135._12_4_ = auVar19._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar224,auVar177);
  auVar75 = vpminsd_avx(auVar216,auVar156);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx(auVar207,auVar135);
  uVar221 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar21._4_4_ = uVar221;
  auVar21._0_4_ = uVar221;
  auVar21._8_4_ = uVar221;
  auVar21._12_4_ = uVar221;
  auVar75 = vmaxps_avx512vl(auVar75,auVar21);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar22._8_4_ = 0x3f7ffffa;
  auVar22._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar22._12_4_ = 0x3f7ffffa;
  local_2d0 = vmulps_avx512vl(auVar76,auVar22);
  auVar76 = vpmaxsd_avx(auVar224,auVar177);
  auVar75 = vpmaxsd_avx(auVar216,auVar156);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx(auVar207,auVar135);
  uVar221 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar19._4_4_ = uVar221;
  auVar19._0_4_ = uVar221;
  auVar19._8_4_ = uVar221;
  auVar19._12_4_ = uVar221;
  auVar75 = vminps_avx512vl(auVar75,auVar19);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar23._8_4_ = 0x3f800003;
  auVar23._0_8_ = 0x3f8000033f800003;
  auVar23._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar23);
  auVar75 = vpbroadcastd_avx512vl();
  uVar15 = vcmpps_avx512vl(local_2d0,auVar76,2);
  local_588 = vpcmpgtd_avx512vl(auVar75,_DAT_01ff0cf0);
  local_588 = ((byte)uVar15 & 0xf) & local_588;
  bVar68 = (char)local_588 == '\0';
  local_9bd = !bVar68;
  if (bVar68) {
    return local_9bd;
  }
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_590 = prim;
LAB_01bfcc6e:
  lVar66 = 0;
  for (uVar70 = local_588; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  local_6f8 = (ulong)*(uint *)(local_590 + 2);
  pGVar3 = (context->scene->geometries).items[local_6f8].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_590 + lVar66 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar132 = (pGVar3->time_range).lower;
  fVar132 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar132) / ((pGVar3->time_range).upper - fVar132));
  auVar76 = vroundss_avx(ZEXT416((uint)fVar132),ZEXT416((uint)fVar132),9);
  auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
  fVar132 = fVar132 - auVar76._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar76._0_4_ * 0x38;
  lVar66 = *(long *)(_Var4 + 0x10 + lVar65);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar65);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar65);
  pfVar1 = (float *)(lVar5 + uVar70 * lVar6);
  auVar136._0_4_ = fVar132 * *pfVar1;
  auVar136._4_4_ = fVar132 * pfVar1[1];
  auVar136._8_4_ = fVar132 * pfVar1[2];
  auVar136._12_4_ = fVar132 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar70 + 1) * lVar6);
  auVar157._0_4_ = fVar132 * *pfVar1;
  auVar157._4_4_ = fVar132 * pfVar1[1];
  auVar157._8_4_ = fVar132 * pfVar1[2];
  auVar157._12_4_ = fVar132 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar70 + 2) * lVar6);
  auVar178._0_4_ = fVar132 * *pfVar1;
  auVar178._4_4_ = fVar132 * pfVar1[1];
  auVar178._8_4_ = fVar132 * pfVar1[2];
  auVar178._12_4_ = fVar132 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar70 + 3));
  auVar200._0_4_ = fVar132 * *pfVar1;
  auVar200._4_4_ = fVar132 * pfVar1[1];
  auVar200._8_4_ = fVar132 * pfVar1[2];
  auVar200._12_4_ = fVar132 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar65);
  fVar132 = 1.0 - fVar132;
  auVar208._4_4_ = fVar132;
  auVar208._0_4_ = fVar132;
  auVar208._8_4_ = fVar132;
  auVar208._12_4_ = fVar132;
  auVar78 = vfmadd231ps_fma(auVar136,auVar208,*(undefined1 (*) [16])(lVar5 + lVar66 * uVar70));
  auVar79 = vfmadd231ps_fma(auVar157,auVar208,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar70 + 1)))
  ;
  auVar85 = vfmadd231ps_fma(auVar178,auVar208,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar70 + 2)))
  ;
  auVar84 = vfmadd231ps_fma(auVar200,auVar208,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar70 + 3)))
  ;
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar75 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar76 = vunpcklps_avx512vl(local_380._0_16_,local_3a0._0_16_);
  _local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar81 = local_3c0._0_16_;
  local_670 = vinsertps_avx512f(auVar76,auVar81,0x28);
  auVar217._0_4_ = auVar78._0_4_ + auVar79._0_4_ + auVar85._0_4_ + auVar84._0_4_;
  auVar217._4_4_ = auVar78._4_4_ + auVar79._4_4_ + auVar85._4_4_ + auVar84._4_4_;
  auVar217._8_4_ = auVar78._8_4_ + auVar79._8_4_ + auVar85._8_4_ + auVar84._8_4_;
  auVar217._12_4_ = auVar78._12_4_ + auVar79._12_4_ + auVar85._12_4_ + auVar84._12_4_;
  auVar24._8_4_ = 0x3e800000;
  auVar24._0_8_ = 0x3e8000003e800000;
  auVar24._12_4_ = 0x3e800000;
  auVar76 = vmulps_avx512vl(auVar217,auVar24);
  auVar76 = vsubps_avx(auVar76,auVar75);
  auVar76 = vdpps_avx(auVar76,local_670,0x7f);
  fVar132 = *(float *)(ray + k * 4 + 0x30);
  local_680 = vdpps_avx(local_670,local_670,0x7f);
  local_470 = vpbroadcastd_avx512vl();
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = local_680._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar225);
  auVar80 = vfnmadd213ss_fma(auVar77,local_680,ZEXT416(0x40000000));
  local_200 = auVar76._0_4_ * auVar77._0_4_ * auVar80._0_4_;
  auVar226._4_4_ = local_200;
  auVar226._0_4_ = local_200;
  auVar226._8_4_ = local_200;
  auVar226._12_4_ = local_200;
  fStack_6b0 = local_200;
  _local_6c0 = auVar226;
  fStack_6ac = local_200;
  fStack_6a8 = local_200;
  fStack_6a4 = local_200;
  auVar76 = vfmadd231ps_fma(auVar75,local_670,auVar226);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar78,auVar76);
  auVar78 = vsubps_avx(auVar85,auVar76);
  auVar79 = vsubps_avx(auVar79,auVar76);
  auVar76 = vsubps_avx(auVar84,auVar76);
  auVar205 = ZEXT3264(_DAT_02020f20);
  uVar221 = auVar75._0_4_;
  local_220._4_4_ = uVar221;
  local_220._0_4_ = uVar221;
  local_220._8_4_ = uVar221;
  local_220._12_4_ = uVar221;
  local_220._16_4_ = uVar221;
  local_220._20_4_ = uVar221;
  local_220._24_4_ = uVar221;
  local_220._28_4_ = uVar221;
  auVar87._8_4_ = 1;
  auVar87._0_8_ = 0x100000001;
  auVar87._12_4_ = 1;
  auVar87._16_4_ = 1;
  auVar87._20_4_ = 1;
  auVar87._24_4_ = 1;
  auVar87._28_4_ = 1;
  local_500 = ZEXT1632(auVar75);
  local_640 = vpermps_avx2(auVar87,local_500);
  auVar88._8_4_ = 2;
  auVar88._0_8_ = 0x200000002;
  auVar88._12_4_ = 2;
  auVar88._16_4_ = 2;
  auVar88._20_4_ = 2;
  auVar88._24_4_ = 2;
  auVar88._28_4_ = 2;
  local_840 = vpermps_avx512vl(auVar88,local_500);
  auVar266 = ZEXT3264(local_840);
  auVar89._8_4_ = 3;
  auVar89._0_8_ = 0x300000003;
  auVar89._12_4_ = 3;
  auVar89._16_4_ = 3;
  auVar89._20_4_ = 3;
  auVar89._24_4_ = 3;
  auVar89._28_4_ = 3;
  local_860 = vpermps_avx512vl(auVar89,local_500);
  auVar267 = ZEXT3264(local_860);
  uVar221 = auVar79._0_4_;
  local_580._4_4_ = uVar221;
  local_580._0_4_ = uVar221;
  local_580._8_4_ = uVar221;
  local_580._12_4_ = uVar221;
  local_580._16_4_ = uVar221;
  local_580._20_4_ = uVar221;
  local_580._24_4_ = uVar221;
  local_580._28_4_ = uVar221;
  local_540 = ZEXT1632(auVar79);
  local_660 = vpermps_avx512vl(auVar87,local_540);
  local_880 = vpermps_avx512vl(auVar88,local_540);
  auVar259 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar89,local_540);
  auVar260 = ZEXT3264(local_8a0);
  local_740 = vbroadcastss_avx512vl(auVar78);
  auVar261 = ZEXT3264(local_740);
  local_520 = ZEXT1632(auVar78);
  local_760 = vpermps_avx512vl(auVar87,local_520);
  auVar262 = ZEXT3264(local_760);
  local_780 = vpermps_avx512vl(auVar88,local_520);
  auVar263 = ZEXT3264(local_780);
  local_8c0 = vpermps_avx512vl(auVar89,local_520);
  auVar264 = ZEXT3264(local_8c0);
  local_8e0 = vbroadcastss_avx512vl(auVar76);
  auVar265 = ZEXT3264(local_8e0);
  _local_560 = ZEXT1632(auVar76);
  local_7a0 = vpermps_avx512vl(auVar87,_local_560);
  auVar270 = ZEXT3264(local_7a0);
  local_7c0 = vpermps_avx2(auVar88,_local_560);
  auVar258 = ZEXT3264(local_7c0);
  local_7e0 = vpermps_avx512vl(auVar89,_local_560);
  auVar268 = ZEXT3264(local_7e0);
  auVar213 = ZEXT3264(local_660);
  auVar197 = ZEXT3264(local_580);
  auVar76 = vmulss_avx512f(auVar81,auVar81);
  auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),local_3a0,local_3a0);
  local_2a0 = vfmadd231ps_avx512vl(auVar86,local_380,local_380);
  local_1e0._0_4_ = local_2a0._0_4_;
  local_1e0._4_4_ = local_1e0._0_4_;
  local_1e0._8_4_ = local_1e0._0_4_;
  local_1e0._12_4_ = local_1e0._0_4_;
  local_1e0._16_4_ = local_1e0._0_4_;
  local_1e0._20_4_ = local_1e0._0_4_;
  local_1e0._24_4_ = local_1e0._0_4_;
  local_1e0._28_4_ = local_1e0._0_4_;
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  auVar86._16_4_ = 0x7fffffff;
  auVar86._20_4_ = 0x7fffffff;
  auVar86._24_4_ = 0x7fffffff;
  auVar86._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar86);
  local_5e0 = ZEXT416((uint)local_200);
  local_200 = fVar132 - local_200;
  auVar269 = ZEXT3264(local_640);
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  bVar63 = 0;
  local_708 = 1;
  local_480 = vpbroadcastd_avx512vl();
  auVar76 = vsqrtss_avx(local_680,local_680);
  local_8e4 = auVar76._0_4_;
  auVar76 = vsqrtss_avx(local_680,local_680);
  local_8e8 = auVar76._0_4_;
  local_600 = ZEXT816(0x3f80000000000000);
  local_700 = 0;
  do {
    auVar76 = vmovshdup_avx(local_600);
    auVar220._0_4_ = local_600._0_4_;
    fVar222 = auVar76._0_4_ - auVar220._0_4_;
    fVar237 = fVar222 * 0.04761905;
    auVar220._4_4_ = auVar220._0_4_;
    auVar220._8_4_ = auVar220._0_4_;
    auVar220._12_4_ = auVar220._0_4_;
    auVar220._16_4_ = auVar220._0_4_;
    auVar220._20_4_ = auVar220._0_4_;
    auVar220._24_4_ = auVar220._0_4_;
    auVar220._28_4_ = auVar220._0_4_;
    local_6a0._4_4_ = fVar222;
    local_6a0._0_4_ = fVar222;
    fStack_698 = fVar222;
    fStack_694 = fVar222;
    register0x00001210 = fVar222;
    register0x00001214 = fVar222;
    register0x00001218 = fVar222;
    register0x0000121c = fVar222;
    auVar76 = vfmadd231ps_fma(auVar220,_local_6a0,auVar205._0_32_);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = &DAT_3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar112._16_4_ = 0x3f800000;
    auVar112._20_4_ = 0x3f800000;
    auVar112._24_4_ = 0x3f800000;
    auVar112._28_4_ = 0x3f800000;
    auVar86 = vsubps_avx(auVar112,ZEXT1632(auVar76));
    fVar222 = auVar76._0_4_;
    auVar105._0_4_ = auVar197._0_4_ * fVar222;
    fVar231 = auVar76._4_4_;
    auVar105._4_4_ = auVar197._4_4_ * fVar231;
    fVar232 = auVar76._8_4_;
    auVar105._8_4_ = auVar197._8_4_ * fVar232;
    fVar233 = auVar76._12_4_;
    auVar105._12_4_ = auVar197._12_4_ * fVar233;
    auVar105._16_4_ = auVar197._16_4_ * 0.0;
    auVar105._20_4_ = auVar197._20_4_ * 0.0;
    auVar105._24_4_ = auVar197._24_4_ * 0.0;
    auVar105._28_4_ = 0;
    auVar90 = ZEXT1632(auVar76);
    auVar205._0_4_ = auVar213._0_4_ * fVar222;
    auVar205._4_4_ = auVar213._4_4_ * fVar231;
    auVar205._8_4_ = auVar213._8_4_ * fVar232;
    auVar205._12_4_ = auVar213._12_4_ * fVar233;
    auVar205._16_4_ = auVar213._16_4_ * 0.0;
    auVar205._20_4_ = auVar213._20_4_ * 0.0;
    auVar205._28_36_ = auVar197._28_36_;
    auVar205._24_4_ = auVar213._24_4_ * 0.0;
    auVar87 = vmulps_avx512vl(auVar259._0_32_,auVar90);
    auVar88 = vmulps_avx512vl(auVar260._0_32_,auVar90);
    auVar75 = vfmadd231ps_fma(auVar105,auVar86,local_220);
    auVar89 = vfmadd231ps_avx512vl(auVar205._0_32_,auVar86,auVar269._0_32_);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar266._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar267._0_32_);
    auVar90 = vmulps_avx512vl(auVar261._0_32_,auVar90);
    auVar97 = ZEXT1632(auVar76);
    auVar91 = vmulps_avx512vl(auVar262._0_32_,auVar97);
    auVar92 = vmulps_avx512vl(auVar263._0_32_,auVar97);
    auVar93 = vmulps_avx512vl(auVar264._0_32_,auVar97);
    auVar78 = vfmadd231ps_fma(auVar90,auVar86,auVar197._0_32_);
    auVar79 = vfmadd231ps_fma(auVar91,auVar86,auVar213._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar86,auVar259._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar86,auVar260._0_32_);
    auVar90 = vmulps_avx512vl(auVar265._0_32_,auVar97);
    auVar93 = vmulps_avx512vl(auVar270._0_32_,auVar97);
    auVar197._0_4_ = auVar258._0_4_ * fVar222;
    auVar197._4_4_ = auVar258._4_4_ * fVar231;
    auVar197._8_4_ = auVar258._8_4_ * fVar232;
    auVar197._12_4_ = auVar258._12_4_ * fVar233;
    auVar197._16_4_ = auVar258._16_4_ * 0.0;
    auVar197._20_4_ = auVar258._20_4_ * 0.0;
    auVar197._28_36_ = auVar257._28_36_;
    auVar197._24_4_ = auVar258._24_4_ * 0.0;
    auVar94 = vmulps_avx512vl(auVar268._0_32_,auVar97);
    auVar95 = vfmadd231ps_avx512vl(auVar90,auVar86,auVar261._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar86,auVar262._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar86,auVar263._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar86,auVar264._0_32_);
    auVar90 = vmulps_avx512vl(auVar97,ZEXT1632(auVar78));
    auVar99 = ZEXT1632(auVar76);
    auVar97 = vmulps_avx512vl(auVar99,ZEXT1632(auVar79));
    auVar98 = vmulps_avx512vl(auVar99,auVar91);
    auVar99 = vmulps_avx512vl(auVar99,auVar92);
    auVar100 = vfmadd231ps_avx512vl(auVar90,auVar86,ZEXT1632(auVar75));
    auVar101 = vfmadd231ps_avx512vl(auVar97,auVar86,auVar89);
    auVar102 = vfmadd231ps_avx512vl(auVar98,auVar86,auVar87);
    auVar103 = vfmadd231ps_avx512vl(auVar99,auVar86,auVar88);
    auVar106._0_4_ = auVar95._0_4_ * fVar222;
    auVar106._4_4_ = auVar95._4_4_ * fVar231;
    auVar106._8_4_ = auVar95._8_4_ * fVar232;
    auVar106._12_4_ = auVar95._12_4_ * fVar233;
    auVar106._16_4_ = auVar95._16_4_ * 0.0;
    auVar106._20_4_ = auVar95._20_4_ * 0.0;
    auVar106._24_4_ = auVar95._24_4_ * 0.0;
    auVar106._28_4_ = 0;
    auVar90._4_4_ = auVar93._4_4_ * fVar231;
    auVar90._0_4_ = auVar93._0_4_ * fVar222;
    auVar90._8_4_ = auVar93._8_4_ * fVar232;
    auVar90._12_4_ = auVar93._12_4_ * fVar233;
    auVar90._16_4_ = auVar93._16_4_ * 0.0;
    auVar90._20_4_ = auVar93._20_4_ * 0.0;
    auVar90._24_4_ = auVar93._24_4_ * 0.0;
    auVar90._28_4_ = auVar95._28_4_;
    auVar97._4_4_ = auVar96._4_4_ * fVar231;
    auVar97._0_4_ = auVar96._0_4_ * fVar222;
    auVar97._8_4_ = auVar96._8_4_ * fVar232;
    auVar97._12_4_ = auVar96._12_4_ * fVar233;
    auVar97._16_4_ = auVar96._16_4_ * 0.0;
    auVar97._20_4_ = auVar96._20_4_ * 0.0;
    auVar97._24_4_ = auVar96._24_4_ * 0.0;
    auVar97._28_4_ = auVar93._28_4_;
    auVar98._4_4_ = auVar94._4_4_ * fVar231;
    auVar98._0_4_ = auVar94._0_4_ * fVar222;
    auVar98._8_4_ = auVar94._8_4_ * fVar232;
    auVar98._12_4_ = auVar94._12_4_ * fVar233;
    auVar98._16_4_ = auVar94._16_4_ * 0.0;
    auVar98._20_4_ = auVar94._20_4_ * 0.0;
    auVar98._24_4_ = auVar94._24_4_ * 0.0;
    auVar98._28_4_ = auVar96._28_4_;
    auVar76 = vfmadd231ps_fma(auVar106,auVar86,ZEXT1632(auVar78));
    auVar75 = vfmadd231ps_fma(auVar90,auVar86,ZEXT1632(auVar79));
    auVar78 = vfmadd231ps_fma(auVar97,auVar86,auVar91);
    auVar79 = vfmadd231ps_fma(auVar98,auVar86,auVar92);
    auVar96._28_4_ = auVar88._28_4_;
    auVar96._0_28_ =
         ZEXT1628(CONCAT412(fVar233 * auVar76._12_4_,
                            CONCAT48(fVar232 * auVar76._8_4_,
                                     CONCAT44(fVar231 * auVar76._4_4_,fVar222 * auVar76._0_4_))));
    auVar99._28_4_ = auVar87._28_4_;
    auVar99._0_28_ =
         ZEXT1628(CONCAT412(auVar75._12_4_ * fVar233,
                            CONCAT48(auVar75._8_4_ * fVar232,
                                     CONCAT44(auVar75._4_4_ * fVar231,auVar75._0_4_ * fVar222))));
    auVar104._28_4_ = auVar89._28_4_;
    auVar104._0_28_ =
         ZEXT1628(CONCAT412(auVar78._12_4_ * fVar233,
                            CONCAT48(auVar78._8_4_ * fVar232,
                                     CONCAT44(auVar78._4_4_ * fVar231,auVar78._0_4_ * fVar222))));
    auVar97 = vfmadd231ps_avx512vl(auVar96,auVar86,auVar100);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar86,auVar101);
    auVar96 = vfmadd231ps_avx512vl(auVar104,auVar86,auVar102);
    auVar88 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar233,
                                            CONCAT48(auVar79._8_4_ * fVar232,
                                                     CONCAT44(auVar79._4_4_ * fVar231,
                                                              auVar79._0_4_ * fVar222)))),auVar103,
                         auVar86);
    auVar86 = vsubps_avx512vl(ZEXT1632(auVar76),auVar100);
    auVar87 = vsubps_avx512vl(ZEXT1632(auVar75),auVar101);
    auVar89 = vsubps_avx512vl(ZEXT1632(auVar78),auVar102);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar79),auVar103);
    auVar100._4_4_ = fVar237 * auVar86._4_4_ * 3.0;
    auVar100._0_4_ = fVar237 * auVar86._0_4_ * 3.0;
    auVar100._8_4_ = fVar237 * auVar86._8_4_ * 3.0;
    auVar100._12_4_ = fVar237 * auVar86._12_4_ * 3.0;
    auVar100._16_4_ = fVar237 * auVar86._16_4_ * 3.0;
    auVar100._20_4_ = fVar237 * auVar86._20_4_ * 3.0;
    auVar100._24_4_ = fVar237 * auVar86._24_4_ * 3.0;
    auVar100._28_4_ = auVar92._28_4_;
    auVar113._0_4_ = fVar237 * auVar87._0_4_ * 3.0;
    auVar113._4_4_ = fVar237 * auVar87._4_4_ * 3.0;
    auVar113._8_4_ = fVar237 * auVar87._8_4_ * 3.0;
    auVar113._12_4_ = fVar237 * auVar87._12_4_ * 3.0;
    auVar113._16_4_ = fVar237 * auVar87._16_4_ * 3.0;
    auVar113._20_4_ = fVar237 * auVar87._20_4_ * 3.0;
    auVar113._24_4_ = fVar237 * auVar87._24_4_ * 3.0;
    auVar113._28_4_ = 0;
    auVar114._0_4_ = auVar89._0_4_ * 3.0 * fVar237;
    auVar114._4_4_ = auVar89._4_4_ * 3.0 * fVar237;
    auVar114._8_4_ = auVar89._8_4_ * 3.0 * fVar237;
    auVar114._12_4_ = auVar89._12_4_ * 3.0 * fVar237;
    auVar114._16_4_ = auVar89._16_4_ * 3.0 * fVar237;
    auVar114._20_4_ = auVar89._20_4_ * 3.0 * fVar237;
    auVar114._24_4_ = auVar89._24_4_ * 3.0 * fVar237;
    auVar114._28_4_ = 0;
    fVar222 = auVar90._0_4_ * 3.0 * fVar237;
    fVar231 = auVar90._4_4_ * 3.0 * fVar237;
    auVar101._4_4_ = fVar231;
    auVar101._0_4_ = fVar222;
    fVar232 = auVar90._8_4_ * 3.0 * fVar237;
    auVar101._8_4_ = fVar232;
    fVar233 = auVar90._12_4_ * 3.0 * fVar237;
    auVar101._12_4_ = fVar233;
    fVar234 = auVar90._16_4_ * 3.0 * fVar237;
    auVar101._16_4_ = fVar234;
    fVar235 = auVar90._20_4_ * 3.0 * fVar237;
    auVar101._20_4_ = fVar235;
    fVar236 = auVar90._24_4_ * 3.0 * fVar237;
    auVar101._24_4_ = fVar236;
    auVar101._28_4_ = fVar237;
    auVar76 = vxorps_avx512vl(auVar270._0_16_,auVar270._0_16_);
    auVar99 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar104 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar89 = ZEXT1632(auVar76);
    auVar105 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,auVar89);
    auVar107._0_4_ = auVar88._0_4_ + fVar222;
    auVar107._4_4_ = auVar88._4_4_ + fVar231;
    auVar107._8_4_ = auVar88._8_4_ + fVar232;
    auVar107._12_4_ = auVar88._12_4_ + fVar233;
    auVar107._16_4_ = auVar88._16_4_ + fVar234;
    auVar107._20_4_ = auVar88._20_4_ + fVar235;
    auVar107._24_4_ = auVar88._24_4_ + fVar236;
    auVar107._28_4_ = auVar88._28_4_ + fVar237;
    auVar86 = vmaxps_avx(auVar88,auVar107);
    auVar87 = vminps_avx(auVar88,auVar107);
    auVar91 = vpermt2ps_avx512vl(auVar88,_DAT_0205fd20,auVar89);
    auVar106 = vpermt2ps_avx512vl(auVar100,_DAT_0205fd20,auVar89);
    auVar107 = vpermt2ps_avx512vl(auVar113,_DAT_0205fd20,auVar89);
    auVar110 = ZEXT1632(auVar76);
    auVar108 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,auVar110);
    auVar88 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,auVar110);
    auVar92 = vsubps_avx512vl(auVar91,auVar88);
    auVar88 = vsubps_avx(auVar99,auVar97);
    auVar89 = vsubps_avx(auVar104,auVar98);
    auVar90 = vsubps_avx(auVar105,auVar96);
    auVar93 = vmulps_avx512vl(auVar89,auVar114);
    auVar93 = vfmsub231ps_avx512vl(auVar93,auVar113,auVar90);
    auVar94 = vmulps_avx512vl(auVar90,auVar100);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar114,auVar88);
    auVar95 = vmulps_avx512vl(auVar88,auVar113);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar100,auVar89);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar93);
    auVar94 = vmulps_avx512vl(auVar90,auVar90);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar89);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar88,auVar88);
    auVar95 = vrcp14ps_avx512vl(auVar94);
    auVar101 = vfnmadd213ps_avx512vl(auVar95,auVar94,auVar112);
    auVar95 = vfmadd132ps_avx512vl(auVar101,auVar95,auVar95);
    auVar93 = vmulps_avx512vl(auVar93,auVar95);
    auVar101 = vmulps_avx512vl(auVar89,auVar108);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar107,auVar90);
    auVar102 = vmulps_avx512vl(auVar90,auVar106);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar108,auVar88);
    auVar103 = vmulps_avx512vl(auVar88,auVar107);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar106,auVar89);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar95 = vmulps_avx512vl(auVar101,auVar95);
    auVar93 = vmaxps_avx512vl(auVar93,auVar95);
    auVar93 = vsqrtps_avx512vl(auVar93);
    auVar95 = vmaxps_avx512vl(auVar92,auVar91);
    auVar86 = vmaxps_avx512vl(auVar86,auVar95);
    auVar95 = vaddps_avx512vl(auVar93,auVar86);
    auVar86 = vminps_avx512vl(auVar92,auVar91);
    auVar86 = vminps_avx(auVar87,auVar86);
    auVar86 = vsubps_avx512vl(auVar86,auVar93);
    auVar91._8_4_ = 0x3f800002;
    auVar91._0_8_ = 0x3f8000023f800002;
    auVar91._12_4_ = 0x3f800002;
    auVar91._16_4_ = 0x3f800002;
    auVar91._20_4_ = 0x3f800002;
    auVar91._24_4_ = 0x3f800002;
    auVar91._28_4_ = 0x3f800002;
    auVar87 = vmulps_avx512vl(auVar95,auVar91);
    auVar92._8_4_ = 0x3f7ffffc;
    auVar92._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar92._12_4_ = 0x3f7ffffc;
    auVar92._16_4_ = 0x3f7ffffc;
    auVar92._20_4_ = 0x3f7ffffc;
    auVar92._24_4_ = 0x3f7ffffc;
    auVar92._28_4_ = 0x3f7ffffc;
    local_820 = vmulps_avx512vl(auVar86,auVar92);
    auVar102._4_4_ = auVar87._4_4_ * auVar87._4_4_;
    auVar102._0_4_ = auVar87._0_4_ * auVar87._0_4_;
    auVar102._8_4_ = auVar87._8_4_ * auVar87._8_4_;
    auVar102._12_4_ = auVar87._12_4_ * auVar87._12_4_;
    auVar102._16_4_ = auVar87._16_4_ * auVar87._16_4_;
    auVar102._20_4_ = auVar87._20_4_ * auVar87._20_4_;
    auVar102._24_4_ = auVar87._24_4_ * auVar87._24_4_;
    auVar102._28_4_ = local_820._28_4_;
    auVar86 = vrsqrt14ps_avx512vl(auVar94);
    auVar93._8_4_ = 0xbf000000;
    auVar93._0_8_ = 0xbf000000bf000000;
    auVar93._12_4_ = 0xbf000000;
    auVar93._16_4_ = 0xbf000000;
    auVar93._20_4_ = 0xbf000000;
    auVar93._24_4_ = 0xbf000000;
    auVar93._28_4_ = 0xbf000000;
    auVar87 = vmulps_avx512vl(auVar94,auVar93);
    auVar103._4_4_ = auVar86._4_4_ * auVar87._4_4_;
    auVar103._0_4_ = auVar86._0_4_ * auVar87._0_4_;
    auVar103._8_4_ = auVar86._8_4_ * auVar87._8_4_;
    auVar103._12_4_ = auVar86._12_4_ * auVar87._12_4_;
    auVar103._16_4_ = auVar86._16_4_ * auVar87._16_4_;
    auVar103._20_4_ = auVar86._20_4_ * auVar87._20_4_;
    auVar103._24_4_ = auVar86._24_4_ * auVar87._24_4_;
    auVar103._28_4_ = auVar87._28_4_;
    auVar87 = vmulps_avx512vl(auVar86,auVar86);
    auVar87 = vmulps_avx512vl(auVar87,auVar103);
    auVar94._8_4_ = 0x3fc00000;
    auVar94._0_8_ = 0x3fc000003fc00000;
    auVar94._12_4_ = 0x3fc00000;
    auVar94._16_4_ = 0x3fc00000;
    auVar94._20_4_ = 0x3fc00000;
    auVar94._24_4_ = 0x3fc00000;
    auVar94._28_4_ = 0x3fc00000;
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar94);
    auVar257 = ZEXT3264(auVar87);
    auVar109._4_4_ = auVar87._4_4_ * auVar88._4_4_;
    auVar109._0_4_ = auVar87._0_4_ * auVar88._0_4_;
    auVar109._8_4_ = auVar87._8_4_ * auVar88._8_4_;
    auVar109._12_4_ = auVar87._12_4_ * auVar88._12_4_;
    auVar109._16_4_ = auVar87._16_4_ * auVar88._16_4_;
    auVar109._20_4_ = auVar87._20_4_ * auVar88._20_4_;
    auVar109._24_4_ = auVar87._24_4_ * auVar88._24_4_;
    auVar109._28_4_ = auVar86._28_4_;
    auVar86 = vmulps_avx512vl(auVar89,auVar87);
    auVar91 = vmulps_avx512vl(auVar90,auVar87);
    auVar92 = vsubps_avx512vl(auVar110,auVar97);
    auVar93 = vsubps_avx512vl(auVar110,auVar98);
    auVar94 = vsubps_avx512vl(auVar110,auVar96);
    auVar95 = vmulps_avx512vl(_local_3c0,auVar94);
    auVar95 = vfmadd231ps_avx512vl(auVar95,local_3a0,auVar93);
    auVar95 = vfmadd231ps_avx512vl(auVar95,local_380,auVar92);
    auVar101 = vmulps_avx512vl(auVar94,auVar94);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar93);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,auVar92);
    auVar103 = vmulps_avx512vl(_local_3c0,auVar91);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar86,local_3a0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_380);
    auVar91 = vmulps_avx512vl(auVar94,auVar91);
    auVar86 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,auVar109);
    local_4c0 = vmulps_avx512vl(auVar103,auVar103);
    auVar91 = vsubps_avx512vl(local_1e0,local_4c0);
    auVar109 = vmulps_avx512vl(auVar103,auVar86);
    auVar95 = vsubps_avx512vl(auVar95,auVar109);
    auVar109 = vaddps_avx512vl(auVar95,auVar95);
    auVar95 = vmulps_avx512vl(auVar86,auVar86);
    local_620 = vsubps_avx512vl(auVar101,auVar95);
    auVar101 = vsubps_avx512vl(local_620,auVar102);
    auVar102 = vmulps_avx512vl(auVar109,auVar109);
    auVar95._8_4_ = 0x40800000;
    auVar95._0_8_ = 0x4080000040800000;
    auVar95._12_4_ = 0x40800000;
    auVar95._16_4_ = 0x40800000;
    auVar95._20_4_ = 0x40800000;
    auVar95._24_4_ = 0x40800000;
    auVar95._28_4_ = 0x40800000;
    _local_800 = vmulps_avx512vl(auVar91,auVar95);
    auVar95 = vmulps_avx512vl(_local_800,auVar101);
    auVar95 = vsubps_avx512vl(auVar102,auVar95);
    uVar70 = vcmpps_avx512vl(auVar95,auVar110,5);
    bVar62 = (byte)uVar70;
    if (bVar62 == 0) {
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar95 = vsqrtps_avx512vl(auVar95);
      auVar110 = vaddps_avx512vl(auVar91,auVar91);
      auVar111 = vrcp14ps_avx512vl(auVar110);
      auVar112 = vfnmadd213ps_avx512vl(auVar110,auVar111,auVar112);
      auVar112 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
      auVar115._8_4_ = 0x80000000;
      auVar115._0_8_ = 0x8000000080000000;
      auVar115._12_4_ = 0x80000000;
      auVar115._16_4_ = 0x80000000;
      auVar115._20_4_ = 0x80000000;
      auVar115._24_4_ = 0x80000000;
      auVar115._28_4_ = 0x80000000;
      auVar110 = vxorps_avx512vl(auVar109,auVar115);
      auVar110 = vsubps_avx512vl(auVar110,auVar95);
      auVar110 = vmulps_avx512vl(auVar110,auVar112);
      auVar95 = vsubps_avx512vl(auVar95,auVar109);
      auVar95 = vmulps_avx512vl(auVar95,auVar112);
      auVar112 = vfmadd213ps_avx512vl(auVar103,auVar110,auVar86);
      local_300 = vmulps_avx512vl(auVar87,auVar112);
      auVar112 = vfmadd213ps_avx512vl(auVar103,auVar95,auVar86);
      local_320 = vmulps_avx512vl(auVar87,auVar112);
      auVar145._8_4_ = 0x7f800000;
      auVar145._0_8_ = 0x7f8000007f800000;
      auVar145._12_4_ = 0x7f800000;
      auVar145._16_4_ = 0x7f800000;
      auVar145._20_4_ = 0x7f800000;
      auVar145._24_4_ = 0x7f800000;
      auVar145._28_4_ = 0x7f800000;
      auVar112 = vblendmps_avx512vl(auVar145,auVar110);
      auVar110._0_4_ =
           (uint)(bVar62 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar62 & 1) * local_320._0_4_;
      bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar68 * auVar112._4_4_ | (uint)!bVar68 * local_320._4_4_;
      bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar68 * auVar112._8_4_ | (uint)!bVar68 * local_320._8_4_;
      bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar68 * auVar112._12_4_ | (uint)!bVar68 * local_320._12_4_;
      bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar110._16_4_ = (uint)bVar68 * auVar112._16_4_ | (uint)!bVar68 * local_320._16_4_;
      bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar110._20_4_ = (uint)bVar68 * auVar112._20_4_ | (uint)!bVar68 * local_320._20_4_;
      bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar110._24_4_ = (uint)bVar68 * auVar112._24_4_ | (uint)!bVar68 * local_320._24_4_;
      bVar68 = SUB81(uVar70 >> 7,0);
      auVar110._28_4_ = (uint)bVar68 * auVar112._28_4_ | (uint)!bVar68 * local_320._28_4_;
      auVar146._8_4_ = 0xff800000;
      auVar146._0_8_ = 0xff800000ff800000;
      auVar146._12_4_ = 0xff800000;
      auVar146._16_4_ = 0xff800000;
      auVar146._20_4_ = 0xff800000;
      auVar146._24_4_ = 0xff800000;
      auVar146._28_4_ = 0xff800000;
      auVar112 = vblendmps_avx512vl(auVar146,auVar95);
      auVar111._0_4_ =
           (uint)(bVar62 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar95._0_4_;
      bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar68 * auVar112._4_4_ | (uint)!bVar68 * auVar95._4_4_;
      bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar68 * auVar112._8_4_ | (uint)!bVar68 * auVar95._8_4_;
      bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar68 * auVar112._12_4_ | (uint)!bVar68 * auVar95._12_4_;
      bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar68 * auVar112._16_4_ | (uint)!bVar68 * auVar95._16_4_;
      bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar68 * auVar112._20_4_ | (uint)!bVar68 * auVar95._20_4_;
      bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar68 * auVar112._24_4_ | (uint)!bVar68 * auVar95._24_4_;
      bVar68 = SUB81(uVar70 >> 7,0);
      auVar111._28_4_ = (uint)bVar68 * auVar112._28_4_ | (uint)!bVar68 * auVar95._28_4_;
      auVar147._8_4_ = 0x7fffffff;
      auVar147._0_8_ = 0x7fffffff7fffffff;
      auVar147._12_4_ = 0x7fffffff;
      auVar147._16_4_ = 0x7fffffff;
      auVar147._20_4_ = 0x7fffffff;
      auVar147._24_4_ = 0x7fffffff;
      auVar147._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_4c0,auVar147);
      auVar95 = vmaxps_avx512vl(local_2a0,auVar111);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      auVar112 = vmulps_avx512vl(auVar95,auVar32);
      auVar95 = vandps_avx(auVar91,auVar147);
      uVar60 = vcmpps_avx512vl(auVar95,auVar112,1);
      uVar70 = uVar70 & uVar60;
      bVar64 = (byte)uVar70;
      if (bVar64 != 0) {
        uVar60 = vcmpps_avx512vl(auVar101,_DAT_02020f00,2);
        auVar170._8_4_ = 0xff800000;
        auVar170._0_8_ = 0xff800000ff800000;
        auVar170._12_4_ = 0xff800000;
        auVar170._16_4_ = 0xff800000;
        auVar170._20_4_ = 0xff800000;
        auVar170._24_4_ = 0xff800000;
        auVar170._28_4_ = 0xff800000;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vblendmps_avx512vl(auVar101,auVar170);
        bVar61 = (byte)uVar60;
        uVar71 = (uint)(bVar61 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar95._0_4_;
        bVar68 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar125 = (uint)bVar68 * auVar112._4_4_ | (uint)!bVar68 * auVar95._4_4_;
        bVar68 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar126 = (uint)bVar68 * auVar112._8_4_ | (uint)!bVar68 * auVar95._8_4_;
        bVar68 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar127 = (uint)bVar68 * auVar112._12_4_ | (uint)!bVar68 * auVar95._12_4_;
        bVar68 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar128 = (uint)bVar68 * auVar112._16_4_ | (uint)!bVar68 * auVar95._16_4_;
        bVar68 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar129 = (uint)bVar68 * auVar112._20_4_ | (uint)!bVar68 * auVar95._20_4_;
        bVar68 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar130 = (uint)bVar68 * auVar112._24_4_ | (uint)!bVar68 * auVar95._24_4_;
        bVar68 = SUB81(uVar60 >> 7,0);
        uVar131 = (uint)bVar68 * auVar112._28_4_ | (uint)!bVar68 * auVar95._28_4_;
        auVar110._0_4_ = (bVar64 & 1) * uVar71 | !(bool)(bVar64 & 1) * auVar110._0_4_;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar110._4_4_ = bVar68 * uVar125 | !bVar68 * auVar110._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar110._8_4_ = bVar68 * uVar126 | !bVar68 * auVar110._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar110._12_4_ = bVar68 * uVar127 | !bVar68 * auVar110._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar110._16_4_ = bVar68 * uVar128 | !bVar68 * auVar110._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar110._20_4_ = bVar68 * uVar129 | !bVar68 * auVar110._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar110._24_4_ = bVar68 * uVar130 | !bVar68 * auVar110._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar110._28_4_ = bVar68 * uVar131 | !bVar68 * auVar110._28_4_;
        auVar95 = vblendmps_avx512vl(auVar170,auVar101);
        bVar68 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar14 = SUB81(uVar60 >> 7,0);
        auVar111._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar61 & 1) * auVar95._0_4_ | !(bool)(bVar61 & 1) * uVar71) |
             !(bool)(bVar64 & 1) * auVar111._0_4_;
        bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar111._4_4_ =
             (uint)bVar8 * ((uint)bVar68 * auVar95._4_4_ | !bVar68 * uVar125) |
             !bVar8 * auVar111._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar111._8_4_ =
             (uint)bVar68 * ((uint)bVar9 * auVar95._8_4_ | !bVar9 * uVar126) |
             !bVar68 * auVar111._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar111._12_4_ =
             (uint)bVar68 * ((uint)bVar10 * auVar95._12_4_ | !bVar10 * uVar127) |
             !bVar68 * auVar111._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar111._16_4_ =
             (uint)bVar68 * ((uint)bVar11 * auVar95._16_4_ | !bVar11 * uVar128) |
             !bVar68 * auVar111._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar111._20_4_ =
             (uint)bVar68 * ((uint)bVar12 * auVar95._20_4_ | !bVar12 * uVar129) |
             !bVar68 * auVar111._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar111._24_4_ =
             (uint)bVar68 * ((uint)bVar13 * auVar95._24_4_ | !bVar13 * uVar130) |
             !bVar68 * auVar111._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar111._28_4_ =
             (uint)bVar68 * ((uint)bVar14 * auVar95._28_4_ | !bVar14 * uVar131) |
             !bVar68 * auVar111._28_4_;
        bVar62 = (~bVar64 | bVar61) & bVar62;
      }
    }
    fVar222 = (float)local_6c0._0_4_;
    fVar231 = (float)local_6c0._4_4_;
    fVar232 = fStack_6b8;
    fVar233 = fStack_6b4;
    fVar237 = fStack_6b0;
    fVar234 = fStack_6ac;
    fVar235 = fStack_6a8;
    fVar236 = fStack_6a4;
    if ((bVar62 & 0x7f) == 0) {
LAB_01bfd9c6:
      auVar205 = ZEXT3264(_DAT_02020f20);
      auVar269 = ZEXT3264(local_640);
      auVar266 = ZEXT3264(local_840);
      auVar267 = ZEXT3264(local_860);
      auVar197 = ZEXT3264(local_580);
      auVar213 = ZEXT3264(local_660);
      auVar259 = ZEXT3264(local_880);
      auVar260 = ZEXT3264(local_8a0);
      auVar261 = ZEXT3264(local_740);
      auVar262 = ZEXT3264(local_760);
      auVar263 = ZEXT3264(local_780);
      auVar264 = ZEXT3264(local_8c0);
      auVar265 = ZEXT3264(local_8e0);
      auVar270 = ZEXT3264(local_7a0);
      auVar258 = ZEXT3264(local_7c0);
      auVar268 = ZEXT3264(local_7e0);
    }
    else {
      fVar244 = *(float *)(ray + k * 4 + 0x80) - (float)local_5e0._0_4_;
      auVar148._4_4_ = fVar244;
      auVar148._0_4_ = fVar244;
      auVar148._8_4_ = fVar244;
      auVar148._12_4_ = fVar244;
      auVar148._16_4_ = fVar244;
      auVar148._20_4_ = fVar244;
      auVar148._24_4_ = fVar244;
      auVar148._28_4_ = fVar244;
      auVar95 = vminps_avx512vl(auVar148,auVar111);
      auVar58._4_4_ = fStack_1fc;
      auVar58._0_4_ = local_200;
      auVar58._8_4_ = fStack_1f8;
      auVar58._12_4_ = fStack_1f4;
      auVar58._16_4_ = fStack_1f0;
      auVar58._20_4_ = fStack_1ec;
      auVar58._24_4_ = fStack_1e8;
      auVar58._28_4_ = fStack_1e4;
      auVar101 = vmaxps_avx512vl(auVar58,auVar110);
      auVar94 = vmulps_avx512vl(auVar94,auVar114);
      auVar93 = vfmadd213ps_avx512vl(auVar93,auVar113,auVar94);
      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar100,auVar93);
      auVar93 = vmulps_avx512vl(_local_3c0,auVar114);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_3a0,auVar113);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_380,auVar100);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar93,auVar94);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar94,auVar100,1);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar92 = vxorps_avx512vl(auVar92,auVar112);
      auVar113 = vrcp14ps_avx512vl(auVar93);
      auVar114 = vxorps_avx512vl(auVar93,auVar112);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar111 = vfnmadd213ps_avx512vl(auVar113,auVar93,auVar110);
      auVar111 = vfmadd132ps_avx512vl(auVar111,auVar113,auVar113);
      auVar111 = vmulps_avx512vl(auVar111,auVar92);
      uVar16 = vcmpps_avx512vl(auVar93,auVar114,1);
      bVar64 = (byte)uVar15 | (byte)uVar16;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar92 = vblendmps_avx512vl(auVar111,auVar115);
      auVar116._0_4_ =
           (uint)(bVar64 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar113._0_4_;
      bVar68 = (bool)(bVar64 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar68 * auVar92._4_4_ | (uint)!bVar68 * auVar113._4_4_;
      bVar68 = (bool)(bVar64 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar68 * auVar92._8_4_ | (uint)!bVar68 * auVar113._8_4_;
      bVar68 = (bool)(bVar64 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar68 * auVar92._12_4_ | (uint)!bVar68 * auVar113._12_4_;
      bVar68 = (bool)(bVar64 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar68 * auVar92._16_4_ | (uint)!bVar68 * auVar113._16_4_;
      bVar68 = (bool)(bVar64 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar68 * auVar92._20_4_ | (uint)!bVar68 * auVar113._20_4_;
      bVar68 = (bool)(bVar64 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar68 * auVar92._24_4_ | (uint)!bVar68 * auVar113._24_4_;
      auVar116._28_4_ =
           (uint)(bVar64 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar113._28_4_;
      auVar92 = vmaxps_avx(auVar101,auVar116);
      uVar16 = vcmpps_avx512vl(auVar93,auVar114,6);
      bVar64 = (byte)uVar15 | (byte)uVar16;
      auVar117._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * auVar111._0_4_;
      bVar68 = (bool)(bVar64 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar111._4_4_;
      bVar68 = (bool)(bVar64 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar111._8_4_;
      bVar68 = (bool)(bVar64 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar111._12_4_;
      bVar68 = (bool)(bVar64 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar111._16_4_;
      bVar68 = (bool)(bVar64 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar111._20_4_;
      bVar68 = (bool)(bVar64 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar111._24_4_;
      auVar117._28_4_ =
           (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar111._28_4_;
      auVar93 = vminps_avx(auVar95,auVar117);
      auVar76 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar76),auVar99);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar76),auVar104);
      auVar101 = ZEXT1632(auVar76);
      auVar104 = vsubps_avx512vl(auVar101,auVar105);
      auVar104 = vmulps_avx512vl(auVar104,auVar108);
      auVar99 = vfnmsub231ps_avx512vl(auVar104,auVar107,auVar99);
      auVar95 = vfnmadd231ps_avx512vl(auVar99,auVar106,auVar95);
      auVar99 = vmulps_avx512vl(_local_3c0,auVar108);
      auVar99 = vfnmsub231ps_avx512vl(auVar99,local_3a0,auVar107);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,local_380,auVar106);
      vandps_avx512vl(auVar99,auVar94);
      uVar15 = vcmpps_avx512vl(auVar99,auVar100,1);
      auVar94 = vxorps_avx512vl(auVar95,auVar112);
      auVar95 = vrcp14ps_avx512vl(auVar99);
      auVar104 = vxorps_avx512vl(auVar99,auVar112);
      auVar100 = vfnmadd213ps_avx512vl(auVar95,auVar99,auVar110);
      auVar76 = vfmadd132ps_fma(auVar100,auVar95,auVar95);
      fVar244 = auVar76._0_4_ * auVar94._0_4_;
      fVar246 = auVar76._4_4_ * auVar94._4_4_;
      auVar108._4_4_ = fVar246;
      auVar108._0_4_ = fVar244;
      fVar247 = auVar76._8_4_ * auVar94._8_4_;
      auVar108._8_4_ = fVar247;
      fVar248 = auVar76._12_4_ * auVar94._12_4_;
      auVar108._12_4_ = fVar248;
      fVar249 = auVar94._16_4_ * 0.0;
      auVar108._16_4_ = fVar249;
      fVar250 = auVar94._20_4_ * 0.0;
      auVar108._20_4_ = fVar250;
      fVar251 = auVar94._24_4_ * 0.0;
      auVar108._24_4_ = fVar251;
      auVar108._28_4_ = auVar94._28_4_;
      uVar16 = vcmpps_avx512vl(auVar99,auVar104,1);
      bVar64 = (byte)uVar15 | (byte)uVar16;
      auVar100 = vblendmps_avx512vl(auVar108,auVar115);
      auVar118._0_4_ =
           (uint)(bVar64 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar95._0_4_;
      bVar68 = (bool)(bVar64 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar68 * auVar100._4_4_ | (uint)!bVar68 * auVar95._4_4_;
      bVar68 = (bool)(bVar64 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar68 * auVar100._8_4_ | (uint)!bVar68 * auVar95._8_4_;
      bVar68 = (bool)(bVar64 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar68 * auVar100._12_4_ | (uint)!bVar68 * auVar95._12_4_;
      bVar68 = (bool)(bVar64 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar68 * auVar100._16_4_ | (uint)!bVar68 * auVar95._16_4_;
      bVar68 = (bool)(bVar64 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar68 * auVar100._20_4_ | (uint)!bVar68 * auVar95._20_4_;
      bVar68 = (bool)(bVar64 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar68 * auVar100._24_4_ | (uint)!bVar68 * auVar95._24_4_;
      auVar118._28_4_ =
           (uint)(bVar64 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar95._28_4_;
      _local_4e0 = vmaxps_avx(auVar92,auVar118);
      uVar16 = vcmpps_avx512vl(auVar99,auVar104,6);
      bVar64 = (byte)uVar15 | (byte)uVar16;
      auVar119._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar244;
      bVar68 = (bool)(bVar64 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar246;
      bVar68 = (bool)(bVar64 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar247;
      bVar68 = (bool)(bVar64 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar248;
      bVar68 = (bool)(bVar64 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar249;
      bVar68 = (bool)(bVar64 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar250;
      bVar68 = (bool)(bVar64 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar251;
      auVar119._28_4_ =
           (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar94._28_4_;
      local_260 = vminps_avx(auVar93,auVar119);
      uVar15 = vcmpps_avx512vl(_local_4e0,local_260,2);
      bVar62 = bVar62 & 0x7f & (byte)uVar15;
      if (bVar62 == 0) goto LAB_01bfd9c6;
      auVar93 = vmaxps_avx512vl(auVar101,local_820);
      auVar92 = vminps_avx512vl(local_300,auVar110);
      auVar49 = ZEXT412(0);
      auVar94 = ZEXT1232(auVar49) << 0x20;
      auVar92 = vmaxps_avx(auVar92,ZEXT1232(auVar49) << 0x20);
      auVar95 = vminps_avx512vl(local_320,auVar110);
      auVar41._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar92._28_4_ + 7.0;
      local_300 = vfmadd213ps_avx512vl(auVar41,_local_6a0,auVar220);
      auVar92 = vmaxps_avx(auVar95,ZEXT1232(auVar49) << 0x20);
      auVar42._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar92._28_4_ + 7.0;
      local_320 = vfmadd213ps_avx512vl(auVar42,_local_6a0,auVar220);
      auVar43._4_4_ = auVar93._4_4_ * auVar93._4_4_;
      auVar43._0_4_ = auVar93._0_4_ * auVar93._0_4_;
      auVar43._8_4_ = auVar93._8_4_ * auVar93._8_4_;
      auVar43._12_4_ = auVar93._12_4_ * auVar93._12_4_;
      auVar43._16_4_ = auVar93._16_4_ * auVar93._16_4_;
      auVar43._20_4_ = auVar93._20_4_ * auVar93._20_4_;
      auVar43._24_4_ = auVar93._24_4_ * auVar93._24_4_;
      auVar43._28_4_ = local_320._28_4_;
      auVar92 = vsubps_avx(local_620,auVar43);
      auVar44._4_4_ = auVar92._4_4_ * (float)local_800._4_4_;
      auVar44._0_4_ = auVar92._0_4_ * (float)local_800._0_4_;
      auVar44._8_4_ = auVar92._8_4_ * fStack_7f8;
      auVar44._12_4_ = auVar92._12_4_ * fStack_7f4;
      auVar44._16_4_ = auVar92._16_4_ * fStack_7f0;
      auVar44._20_4_ = auVar92._20_4_ * fStack_7ec;
      auVar44._24_4_ = auVar92._24_4_ * fStack_7e8;
      auVar44._28_4_ = local_320._28_4_;
      auVar93 = vsubps_avx(auVar102,auVar44);
      uVar15 = vcmpps_avx512vl(auVar93,ZEXT1232(auVar49) << 0x20,5);
      bVar64 = (byte)uVar15;
      auVar270 = ZEXT3264(local_7a0);
      auVar268 = ZEXT3264(local_7e0);
      if (bVar64 == 0) {
        auVar86 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar197 = ZEXT864(0) << 0x20;
        auVar93 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar245 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar120._8_4_ = 0x7f800000;
        auVar120._0_8_ = 0x7f8000007f800000;
        auVar120._12_4_ = 0x7f800000;
        auVar120._16_4_ = 0x7f800000;
        auVar120._20_4_ = 0x7f800000;
        auVar120._24_4_ = 0x7f800000;
        auVar120._28_4_ = 0x7f800000;
        auVar121._8_4_ = 0xff800000;
        auVar121._0_8_ = 0xff800000ff800000;
        auVar121._12_4_ = 0xff800000;
        auVar121._16_4_ = 0xff800000;
        auVar121._20_4_ = 0xff800000;
        auVar121._24_4_ = 0xff800000;
        auVar121._28_4_ = 0xff800000;
      }
      else {
        auVar75 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
        uVar70 = vcmpps_avx512vl(auVar93,auVar101,5);
        auVar93 = vsqrtps_avx(auVar93);
        auVar171._0_4_ = auVar91._0_4_ + auVar91._0_4_;
        auVar171._4_4_ = auVar91._4_4_ + auVar91._4_4_;
        auVar171._8_4_ = auVar91._8_4_ + auVar91._8_4_;
        auVar171._12_4_ = auVar91._12_4_ + auVar91._12_4_;
        auVar171._16_4_ = auVar91._16_4_ + auVar91._16_4_;
        auVar171._20_4_ = auVar91._20_4_ + auVar91._20_4_;
        auVar171._24_4_ = auVar91._24_4_ + auVar91._24_4_;
        auVar171._28_4_ = auVar91._28_4_ + auVar91._28_4_;
        auVar94 = vrcp14ps_avx512vl(auVar171);
        auVar95 = vfnmadd213ps_avx512vl(auVar171,auVar94,auVar110);
        auVar76 = vfmadd132ps_fma(auVar95,auVar94,auVar94);
        auVar33._8_4_ = 0x80000000;
        auVar33._0_8_ = 0x8000000080000000;
        auVar33._12_4_ = 0x80000000;
        auVar33._16_4_ = 0x80000000;
        auVar33._20_4_ = 0x80000000;
        auVar33._24_4_ = 0x80000000;
        auVar33._28_4_ = 0x80000000;
        auVar94 = vxorps_avx512vl(auVar109,auVar33);
        auVar94 = vsubps_avx(auVar94,auVar93);
        auVar45._4_4_ = auVar94._4_4_ * auVar76._4_4_;
        auVar45._0_4_ = auVar94._0_4_ * auVar76._0_4_;
        auVar45._8_4_ = auVar94._8_4_ * auVar76._8_4_;
        auVar45._12_4_ = auVar94._12_4_ * auVar76._12_4_;
        auVar45._16_4_ = auVar94._16_4_ * 0.0;
        auVar45._20_4_ = auVar94._20_4_ * 0.0;
        auVar45._24_4_ = auVar94._24_4_ * 0.0;
        auVar45._28_4_ = 0x3e000000;
        auVar93 = vsubps_avx512vl(auVar93,auVar109);
        auVar46._4_4_ = auVar93._4_4_ * auVar76._4_4_;
        auVar46._0_4_ = auVar93._0_4_ * auVar76._0_4_;
        auVar46._8_4_ = auVar93._8_4_ * auVar76._8_4_;
        auVar46._12_4_ = auVar93._12_4_ * auVar76._12_4_;
        auVar46._16_4_ = auVar93._16_4_ * 0.0;
        auVar46._20_4_ = auVar93._20_4_ * 0.0;
        auVar46._24_4_ = auVar93._24_4_ * 0.0;
        auVar46._28_4_ = auVar220._0_4_;
        auVar93 = vfmadd213ps_avx512vl(auVar103,auVar45,auVar86);
        auVar47._4_4_ = auVar87._4_4_ * auVar93._4_4_;
        auVar47._0_4_ = auVar87._0_4_ * auVar93._0_4_;
        auVar47._8_4_ = auVar87._8_4_ * auVar93._8_4_;
        auVar47._12_4_ = auVar87._12_4_ * auVar93._12_4_;
        auVar47._16_4_ = auVar87._16_4_ * auVar93._16_4_;
        auVar47._20_4_ = auVar87._20_4_ * auVar93._20_4_;
        auVar47._24_4_ = auVar87._24_4_ * auVar93._24_4_;
        auVar47._28_4_ = auVar94._28_4_;
        auVar93 = vmulps_avx512vl(local_380,auVar45);
        auVar94 = vmulps_avx512vl(local_3a0,auVar45);
        auVar99 = vmulps_avx512vl(_local_3c0,auVar45);
        auVar95 = vfmadd213ps_avx512vl(auVar88,auVar47,auVar97);
        auVar93 = vsubps_avx512vl(auVar93,auVar95);
        auVar95 = vfmadd213ps_avx512vl(auVar89,auVar47,auVar98);
        auVar95 = vsubps_avx512vl(auVar94,auVar95);
        auVar76 = vfmadd213ps_fma(auVar47,auVar90,auVar96);
        auVar94 = vsubps_avx(auVar99,ZEXT1632(auVar76));
        auVar245 = auVar94._0_28_;
        auVar86 = vfmadd213ps_avx512vl(auVar103,auVar46,auVar86);
        auVar87 = vmulps_avx512vl(auVar87,auVar86);
        auVar257 = ZEXT3264(auVar87);
        auVar86 = vmulps_avx512vl(local_380,auVar46);
        auVar99 = vmulps_avx512vl(local_3a0,auVar46);
        auVar104 = vmulps_avx512vl(_local_3c0,auVar46);
        auVar76 = vfmadd213ps_fma(auVar88,auVar87,auVar97);
        auVar94 = vsubps_avx(auVar86,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar89,auVar87,auVar98);
        auVar86 = vsubps_avx512vl(auVar99,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar90,auVar87,auVar96);
        auVar87 = vsubps_avx512vl(auVar104,ZEXT1632(auVar76));
        auVar197 = ZEXT3264(auVar87);
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar193,auVar45);
        bVar68 = (bool)((byte)uVar70 & 1);
        auVar120._0_4_ = (uint)bVar68 * auVar87._0_4_ | (uint)!bVar68 * auVar97._0_4_;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar68 * auVar87._4_4_ | (uint)!bVar68 * auVar97._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar68 * auVar87._8_4_ | (uint)!bVar68 * auVar97._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar68 * auVar87._12_4_ | (uint)!bVar68 * auVar97._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar120._16_4_ = (uint)bVar68 * auVar87._16_4_ | (uint)!bVar68 * auVar97._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar120._20_4_ = (uint)bVar68 * auVar87._20_4_ | (uint)!bVar68 * auVar97._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar120._24_4_ = (uint)bVar68 * auVar87._24_4_ | (uint)!bVar68 * auVar97._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar120._28_4_ = (uint)bVar68 * auVar87._28_4_ | (uint)!bVar68 * auVar97._28_4_;
        auVar194._8_4_ = 0xff800000;
        auVar194._0_8_ = 0xff800000ff800000;
        auVar194._12_4_ = 0xff800000;
        auVar194._16_4_ = 0xff800000;
        auVar194._20_4_ = 0xff800000;
        auVar194._24_4_ = 0xff800000;
        auVar194._28_4_ = 0xff800000;
        auVar87 = vblendmps_avx512vl(auVar194,auVar46);
        bVar68 = (bool)((byte)uVar70 & 1);
        auVar121._0_4_ = (uint)bVar68 * auVar87._0_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar68 * auVar87._4_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar68 * auVar87._8_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar68 * auVar87._12_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar121._16_4_ = (uint)bVar68 * auVar87._16_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar121._20_4_ = (uint)bVar68 * auVar87._20_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar121._24_4_ = (uint)bVar68 * auVar87._24_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar121._28_4_ = (uint)bVar68 * auVar87._28_4_ | (uint)!bVar68 * -0x800000;
        auVar240._8_4_ = 0x7fffffff;
        auVar240._0_8_ = 0x7fffffff7fffffff;
        auVar240._12_4_ = 0x7fffffff;
        auVar240._16_4_ = 0x7fffffff;
        auVar240._20_4_ = 0x7fffffff;
        auVar240._24_4_ = 0x7fffffff;
        auVar240._28_4_ = 0x7fffffff;
        auVar87 = vandps_avx(auVar240,local_4c0);
        auVar87 = vmaxps_avx(local_2a0,auVar87);
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar88 = vmulps_avx512vl(auVar87,auVar34);
        auVar87 = vandps_avx(auVar91,auVar240);
        uVar60 = vcmpps_avx512vl(auVar87,auVar88,1);
        uVar70 = uVar70 & uVar60;
        bVar61 = (byte)uVar70;
        if (bVar61 != 0) {
          uVar60 = vcmpps_avx512vl(auVar92,ZEXT1632(auVar75),2);
          auVar241._8_4_ = 0xff800000;
          auVar241._0_8_ = 0xff800000ff800000;
          auVar241._12_4_ = 0xff800000;
          auVar241._16_4_ = 0xff800000;
          auVar241._20_4_ = 0xff800000;
          auVar241._24_4_ = 0xff800000;
          auVar241._28_4_ = 0xff800000;
          auVar253._8_4_ = 0x7f800000;
          auVar253._0_8_ = 0x7f8000007f800000;
          auVar253._12_4_ = 0x7f800000;
          auVar253._16_4_ = 0x7f800000;
          auVar253._20_4_ = 0x7f800000;
          auVar253._24_4_ = 0x7f800000;
          auVar253._28_4_ = 0x7f800000;
          auVar87 = vblendmps_avx512vl(auVar253,auVar241);
          bVar59 = (byte)uVar60;
          uVar71 = (uint)(bVar59 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar88._0_4_;
          bVar68 = (bool)((byte)(uVar60 >> 1) & 1);
          uVar125 = (uint)bVar68 * auVar87._4_4_ | (uint)!bVar68 * auVar88._4_4_;
          bVar68 = (bool)((byte)(uVar60 >> 2) & 1);
          uVar126 = (uint)bVar68 * auVar87._8_4_ | (uint)!bVar68 * auVar88._8_4_;
          bVar68 = (bool)((byte)(uVar60 >> 3) & 1);
          uVar127 = (uint)bVar68 * auVar87._12_4_ | (uint)!bVar68 * auVar88._12_4_;
          bVar68 = (bool)((byte)(uVar60 >> 4) & 1);
          uVar128 = (uint)bVar68 * auVar87._16_4_ | (uint)!bVar68 * auVar88._16_4_;
          bVar68 = (bool)((byte)(uVar60 >> 5) & 1);
          uVar129 = (uint)bVar68 * auVar87._20_4_ | (uint)!bVar68 * auVar88._20_4_;
          bVar68 = (bool)((byte)(uVar60 >> 6) & 1);
          uVar130 = (uint)bVar68 * auVar87._24_4_ | (uint)!bVar68 * auVar88._24_4_;
          bVar68 = SUB81(uVar60 >> 7,0);
          uVar131 = (uint)bVar68 * auVar87._28_4_ | (uint)!bVar68 * auVar88._28_4_;
          auVar120._0_4_ = (bVar61 & 1) * uVar71 | !(bool)(bVar61 & 1) * auVar120._0_4_;
          bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar120._4_4_ = bVar68 * uVar125 | !bVar68 * auVar120._4_4_;
          bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar120._8_4_ = bVar68 * uVar126 | !bVar68 * auVar120._8_4_;
          bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar120._12_4_ = bVar68 * uVar127 | !bVar68 * auVar120._12_4_;
          bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar120._16_4_ = bVar68 * uVar128 | !bVar68 * auVar120._16_4_;
          bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar120._20_4_ = bVar68 * uVar129 | !bVar68 * auVar120._20_4_;
          bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar120._24_4_ = bVar68 * uVar130 | !bVar68 * auVar120._24_4_;
          bVar68 = SUB81(uVar70 >> 7,0);
          auVar120._28_4_ = bVar68 * uVar131 | !bVar68 * auVar120._28_4_;
          auVar87 = vblendmps_avx512vl(auVar241,auVar253);
          bVar68 = (bool)((byte)(uVar60 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar60 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
          bVar14 = SUB81(uVar60 >> 7,0);
          auVar121._0_4_ =
               (uint)(bVar61 & 1) *
               ((uint)(bVar59 & 1) * auVar87._0_4_ | !(bool)(bVar59 & 1) * uVar71) |
               !(bool)(bVar61 & 1) * auVar121._0_4_;
          bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar121._4_4_ =
               (uint)bVar8 * ((uint)bVar68 * auVar87._4_4_ | !bVar68 * uVar125) |
               !bVar8 * auVar121._4_4_;
          bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar121._8_4_ =
               (uint)bVar68 * ((uint)bVar9 * auVar87._8_4_ | !bVar9 * uVar126) |
               !bVar68 * auVar121._8_4_;
          bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar121._12_4_ =
               (uint)bVar68 * ((uint)bVar10 * auVar87._12_4_ | !bVar10 * uVar127) |
               !bVar68 * auVar121._12_4_;
          bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar121._16_4_ =
               (uint)bVar68 * ((uint)bVar11 * auVar87._16_4_ | !bVar11 * uVar128) |
               !bVar68 * auVar121._16_4_;
          bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar121._20_4_ =
               (uint)bVar68 * ((uint)bVar12 * auVar87._20_4_ | !bVar12 * uVar129) |
               !bVar68 * auVar121._20_4_;
          bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar121._24_4_ =
               (uint)bVar68 * ((uint)bVar13 * auVar87._24_4_ | !bVar13 * uVar130) |
               !bVar68 * auVar121._24_4_;
          bVar68 = SUB81(uVar70 >> 7,0);
          auVar121._28_4_ =
               (uint)bVar68 * ((uint)bVar14 * auVar87._28_4_ | !bVar14 * uVar131) |
               !bVar68 * auVar121._28_4_;
          bVar64 = (~bVar61 | bVar59) & bVar64;
        }
      }
      auVar252._8_4_ = 0x7fffffff;
      auVar252._0_8_ = 0x7fffffff7fffffff;
      auVar252._12_4_ = 0x7fffffff;
      auVar266 = ZEXT3264(local_840);
      auVar267 = ZEXT3264(local_860);
      auVar259 = ZEXT3264(local_880);
      auVar260 = ZEXT3264(local_8a0);
      auVar264 = ZEXT3264(local_8c0);
      auVar265 = ZEXT3264(local_8e0);
      auVar258 = ZEXT3264(local_7c0);
      auVar213._0_4_ = (float)local_3c0._0_4_ * auVar197._0_4_;
      auVar213._4_4_ = (float)local_3c0._4_4_ * auVar197._4_4_;
      auVar213._8_4_ = fStack_3b8 * auVar197._8_4_;
      auVar213._12_4_ = fStack_3b4 * auVar197._12_4_;
      auVar213._16_4_ = fStack_3b0 * auVar197._16_4_;
      auVar213._20_4_ = fStack_3ac * auVar197._20_4_;
      auVar213._28_36_ = auVar197._28_36_;
      auVar213._24_4_ = fStack_3a8 * auVar197._24_4_;
      auVar76 = vfmadd231ps_fma(auVar213._0_32_,local_3a0,auVar86);
      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_380,auVar94);
      _local_1c0 = _local_4e0;
      local_1a0 = vminps_avx(local_260,auVar120);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar86 = vandps_avx(ZEXT1632(auVar76),auVar230);
      _local_280 = vmaxps_avx(_local_4e0,auVar121);
      auVar195._8_4_ = 0x3e99999a;
      auVar195._0_8_ = 0x3e99999a3e99999a;
      auVar195._12_4_ = 0x3e99999a;
      auVar195._16_4_ = 0x3e99999a;
      auVar195._20_4_ = 0x3e99999a;
      auVar195._24_4_ = 0x3e99999a;
      auVar195._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar86,auVar195,1);
      local_8ec = (undefined4)uVar15;
      uVar15 = vcmpps_avx512vl(_local_4e0,local_1a0,2);
      bVar61 = (byte)uVar15 & bVar62;
      _local_360 = _local_280;
      uVar16 = vcmpps_avx512vl(_local_280,local_260,2);
      auVar261 = ZEXT3264(local_740);
      auVar262 = ZEXT3264(local_760);
      auVar263 = ZEXT3264(local_780);
      if ((bVar62 & ((byte)uVar16 | (byte)uVar15)) == 0) {
        auVar205 = ZEXT3264(_DAT_02020f20);
        auVar269 = ZEXT3264(local_640);
        auVar197 = ZEXT3264(local_580);
        auVar213 = ZEXT3264(local_660);
      }
      else {
        auVar48._4_4_ = (float)local_3c0._4_4_ * auVar245._4_4_;
        auVar48._0_4_ = (float)local_3c0._0_4_ * auVar245._0_4_;
        auVar48._8_4_ = fStack_3b8 * auVar245._8_4_;
        auVar48._12_4_ = fStack_3b4 * auVar245._12_4_;
        auVar48._16_4_ = fStack_3b0 * auVar245._16_4_;
        auVar48._20_4_ = fStack_3ac * auVar245._20_4_;
        auVar48._24_4_ = fStack_3a8 * auVar245._24_4_;
        auVar48._28_4_ = 0x3e99999a;
        auVar76 = vfmadd213ps_fma(auVar95,local_3a0,auVar48);
        auVar76 = vfmadd213ps_fma(auVar93,local_380,ZEXT1632(auVar76));
        auVar86 = vandps_avx(ZEXT1632(auVar76),auVar230);
        uVar15 = vcmpps_avx512vl(auVar86,auVar195,1);
        local_8f4 = (uint)(byte)~bVar64;
        bVar64 = (byte)uVar15 | ~bVar64;
        auVar149._8_4_ = 2;
        auVar149._0_8_ = 0x200000002;
        auVar149._12_4_ = 2;
        auVar149._16_4_ = 2;
        auVar149._20_4_ = 2;
        auVar149._24_4_ = 2;
        auVar149._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar86 = vpblendmd_avx512vl(auVar149,auVar35);
        local_240._0_4_ = (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar68 = (bool)(bVar64 >> 1 & 1);
        local_240._4_4_ = (uint)bVar68 * auVar86._4_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar64 >> 2 & 1);
        local_240._8_4_ = (uint)bVar68 * auVar86._8_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar64 >> 3 & 1);
        local_240._12_4_ = (uint)bVar68 * auVar86._12_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar64 >> 4 & 1);
        local_240._16_4_ = (uint)bVar68 * auVar86._16_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar64 >> 5 & 1);
        local_240._20_4_ = (uint)bVar68 * auVar86._20_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar64 >> 6 & 1);
        local_240._24_4_ = (uint)bVar68 * auVar86._24_4_ | (uint)!bVar68 * 2;
        local_240._28_4_ = (uint)(bVar64 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
        local_2c0 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_2c0,local_240,5);
        local_8f0 = (uint)bVar61;
        bVar61 = (byte)uVar15 & bVar61;
        if (bVar61 != 0) {
          auVar75 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar76 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar78 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar79 = vminps_avx(auVar75,auVar78);
          auVar75 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar78 = vmaxps_avx(auVar76,auVar75);
          auVar76 = vandps_avx(auVar252,auVar79);
          auVar75 = vandps_avx(auVar252,auVar78);
          auVar76 = vmaxps_avx(auVar76,auVar75);
          auVar75 = vmovshdup_avx(auVar76);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          fVar222 = auVar76._0_4_ * 1.9073486e-06;
          local_5f0 = vshufps_avx(auVar78,auVar78,0xff);
          local_340 = (float)local_4e0._0_4_ + (float)local_6c0._0_4_;
          fStack_33c = (float)local_4e0._4_4_ + (float)local_6c0._4_4_;
          fStack_338 = fStack_4d8 + fStack_6b8;
          fStack_334 = fStack_4d4 + fStack_6b4;
          fStack_330 = fStack_4d0 + fStack_6b0;
          fStack_32c = fStack_4cc + fStack_6ac;
          fStack_328 = fStack_4c8 + fStack_6a8;
          fStack_324 = fStack_4c4 + fStack_6a4;
          do {
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar86 = vblendmps_avx512vl(auVar150,_local_4e0);
            auVar122._0_4_ =
                 (uint)(bVar61 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 1 & 1);
            auVar122._4_4_ = (uint)bVar68 * auVar86._4_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 2 & 1);
            auVar122._8_4_ = (uint)bVar68 * auVar86._8_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 3 & 1);
            auVar122._12_4_ = (uint)bVar68 * auVar86._12_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 4 & 1);
            auVar122._16_4_ = (uint)bVar68 * auVar86._16_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 5 & 1);
            auVar122._20_4_ = (uint)bVar68 * auVar86._20_4_ | (uint)!bVar68 * 0x7f800000;
            auVar122._24_4_ =
                 (uint)(bVar61 >> 6) * auVar86._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
            auVar122._28_4_ = 0x7f800000;
            auVar86 = vshufps_avx(auVar122,auVar122,0xb1);
            auVar86 = vminps_avx(auVar122,auVar86);
            auVar87 = vshufpd_avx(auVar86,auVar86,5);
            auVar86 = vminps_avx(auVar86,auVar87);
            auVar87 = vpermpd_avx2(auVar86,0x4e);
            auVar86 = vminps_avx(auVar86,auVar87);
            uVar15 = vcmpps_avx512vl(auVar122,auVar86,0);
            bVar59 = (byte)uVar15 & bVar61;
            bVar64 = bVar61;
            if (bVar59 != 0) {
              bVar64 = bVar59;
            }
            iVar18 = 0;
            for (uVar71 = (uint)bVar64; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            bVar64 = '\x01' << ((byte)iVar18 & 0x1f);
            uVar71 = *(uint *)(local_300 + (uint)(iVar18 << 2));
            fVar232 = local_8e8;
            fVar231 = *(float *)(local_1c0 + (uint)(iVar18 << 2));
            uVar221 = 0;
            fVar233 = (float)0;
            fVar237 = (float)0;
            if ((float)local_680._0_4_ < 0.0) {
              _local_800 = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar18 << 2)));
              fVar232 = sqrtf((float)local_680._0_4_);
              fVar231 = (float)local_800._0_4_;
              uVar221 = local_800._4_4_;
              fVar233 = fStack_7f8;
              fVar237 = fStack_7f4;
            }
            auVar197 = ZEXT464(uVar71);
            bVar59 = ~bVar64;
            lVar66 = 5;
            do {
              auVar86 = _local_800;
              auVar137._4_4_ = fVar231;
              auVar137._0_4_ = fVar231;
              auVar137._8_4_ = fVar231;
              auVar137._12_4_ = fVar231;
              auVar75 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_670);
              fVar235 = auVar197._0_4_;
              fVar234 = 1.0 - fVar235;
              auVar179._0_4_ = local_540._0_4_ * fVar235;
              auVar179._4_4_ = local_540._4_4_ * fVar235;
              auVar179._8_4_ = local_540._8_4_ * fVar235;
              auVar179._12_4_ = local_540._12_4_ * fVar235;
              local_4c0._0_16_ = ZEXT416((uint)fVar234);
              auVar201._4_4_ = fVar234;
              auVar201._0_4_ = fVar234;
              auVar201._8_4_ = fVar234;
              auVar201._12_4_ = fVar234;
              auVar76 = vfmadd231ps_fma(auVar179,auVar201,local_500._0_16_);
              auVar209._0_4_ = local_520._0_4_ * fVar235;
              auVar209._4_4_ = local_520._4_4_ * fVar235;
              auVar209._8_4_ = local_520._8_4_ * fVar235;
              auVar209._12_4_ = local_520._12_4_ * fVar235;
              auVar78 = vfmadd231ps_fma(auVar209,auVar201,local_540._0_16_);
              auVar218._0_4_ = fVar235 * (float)local_560._0_4_;
              auVar218._4_4_ = fVar235 * (float)local_560._4_4_;
              auVar218._8_4_ = fVar235 * fStack_558;
              auVar218._12_4_ = fVar235 * fStack_554;
              auVar79 = vfmadd231ps_fma(auVar218,auVar201,local_520._0_16_);
              auVar227._0_4_ = fVar235 * auVar78._0_4_;
              auVar227._4_4_ = fVar235 * auVar78._4_4_;
              auVar227._8_4_ = fVar235 * auVar78._8_4_;
              auVar227._12_4_ = fVar235 * auVar78._12_4_;
              auVar76 = vfmadd231ps_fma(auVar227,auVar201,auVar76);
              auVar180._0_4_ = fVar235 * auVar79._0_4_;
              auVar180._4_4_ = fVar235 * auVar79._4_4_;
              auVar180._8_4_ = fVar235 * auVar79._8_4_;
              auVar180._12_4_ = fVar235 * auVar79._12_4_;
              auVar78 = vfmadd231ps_fma(auVar180,auVar201,auVar78);
              auVar210._0_4_ = fVar235 * auVar78._0_4_;
              auVar210._4_4_ = fVar235 * auVar78._4_4_;
              auVar210._8_4_ = fVar235 * auVar78._8_4_;
              auVar210._12_4_ = fVar235 * auVar78._12_4_;
              auVar79 = vfmadd231ps_fma(auVar210,auVar76,auVar201);
              auVar76 = vsubps_avx(auVar78,auVar76);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar76,auVar25);
              local_620._0_16_ = auVar79;
              auVar76 = vsubps_avx(auVar75,auVar79);
              _local_6a0 = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_820._0_16_ = auVar76;
              local_800._4_4_ = uVar221;
              local_800._0_4_ = fVar231;
              fStack_7f8 = fVar233;
              _fStack_7f0 = auVar86._16_16_;
              fStack_7f4 = fVar237;
              if (auVar76._0_4_ < 0.0) {
                auVar257._0_4_ = sqrtf(auVar76._0_4_);
                auVar257._4_60_ = extraout_var;
                auVar76 = auVar257._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
              }
              local_5a0 = vdpps_avx(auVar78,auVar78,0x7f);
              fVar231 = local_5a0._0_4_;
              auVar181._4_12_ = ZEXT812(0) << 0x20;
              auVar181._0_4_ = fVar231;
              auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              fVar233 = auVar75._0_4_;
              local_5b0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(local_5a0,auVar26);
              auVar75 = vfnmadd213ss_fma(local_5b0,local_5a0,ZEXT416(0x40000000));
              uVar71 = auVar76._0_4_;
              if (fVar231 < auVar79._0_4_) {
                auVar258._0_4_ = sqrtf(fVar231);
                auVar258._4_60_ = extraout_var_00;
                auVar76 = ZEXT416(uVar71);
                auVar79 = auVar258._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx512f(local_5a0,local_5a0);
              }
              fVar231 = fVar233 * 1.5 + fVar231 * -0.5 * fVar233 * fVar233 * fVar233;
              auVar138._0_4_ = auVar78._0_4_ * fVar231;
              auVar138._4_4_ = auVar78._4_4_ * fVar231;
              auVar138._8_4_ = auVar78._8_4_ * fVar231;
              auVar138._12_4_ = auVar78._12_4_ * fVar231;
              auVar85 = vdpps_avx(_local_6a0,auVar138,0x7f);
              auVar77 = vaddss_avx512f(auVar76,ZEXT416(0x3f800000));
              auVar139._0_4_ = auVar85._0_4_ * auVar85._0_4_;
              auVar139._4_4_ = auVar85._4_4_ * auVar85._4_4_;
              auVar139._8_4_ = auVar85._8_4_ * auVar85._8_4_;
              auVar139._12_4_ = auVar85._12_4_ * auVar85._12_4_;
              auVar84 = vsubps_avx(local_820._0_16_,auVar139);
              fVar233 = auVar84._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar233;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              auVar81 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
              uVar69 = fVar233 == 0.0;
              uVar67 = fVar233 < 0.0;
              if ((bool)uVar67) {
                local_5d0 = fVar231;
                fStack_5cc = fVar231;
                fStack_5c8 = fVar231;
                fStack_5c4 = fVar231;
                local_5c0 = auVar80;
                fVar234 = sqrtf(fVar233);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar76 = ZEXT416(uVar71);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar80 = local_5c0;
                fVar231 = local_5d0;
                fVar237 = fStack_5cc;
                fVar236 = fStack_5c8;
                fVar244 = fStack_5c4;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar234 = auVar84._0_4_;
                fVar237 = fVar231;
                fVar236 = fVar231;
                fVar244 = fVar231;
              }
              auVar252._8_4_ = 0x7fffffff;
              auVar252._0_8_ = 0x7fffffff7fffffff;
              auVar252._12_4_ = 0x7fffffff;
              auVar266 = ZEXT3264(local_840);
              auVar267 = ZEXT3264(local_860);
              auVar259 = ZEXT3264(local_880);
              auVar260 = ZEXT3264(local_8a0);
              auVar261 = ZEXT3264(local_740);
              auVar262 = ZEXT3264(local_760);
              auVar263 = ZEXT3264(local_780);
              auVar264 = ZEXT3264(local_8c0);
              auVar265 = ZEXT3264(local_8e0);
              auVar270 = ZEXT3264(local_7a0);
              auVar258 = ZEXT3264(local_7c0);
              auVar268 = ZEXT3264(local_7e0);
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar197._0_16_,
                                        local_4c0._0_16_);
              fVar246 = auVar84._0_4_ * 6.0;
              fVar247 = fVar235 * 6.0;
              auVar182._0_4_ = fVar247 * (float)local_560._0_4_;
              auVar182._4_4_ = fVar247 * (float)local_560._4_4_;
              auVar182._8_4_ = fVar247 * fStack_558;
              auVar182._12_4_ = fVar247 * fStack_554;
              auVar159._4_4_ = fVar246;
              auVar159._0_4_ = fVar246;
              auVar159._8_4_ = fVar246;
              auVar159._12_4_ = fVar246;
              auVar84 = vfmadd132ps_fma(auVar159,auVar182,local_520._0_16_);
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4c0._0_16_,
                                        auVar197._0_16_);
              fVar246 = auVar83._0_4_ * 6.0;
              auVar183._4_4_ = fVar246;
              auVar183._0_4_ = fVar246;
              auVar183._8_4_ = fVar246;
              auVar183._12_4_ = fVar246;
              auVar84 = vfmadd132ps_fma(auVar183,auVar84,local_540._0_16_);
              fVar246 = local_4c0._0_4_ * 6.0;
              auVar160._4_4_ = fVar246;
              auVar160._0_4_ = fVar246;
              auVar160._8_4_ = fVar246;
              auVar160._12_4_ = fVar246;
              auVar84 = vfmadd132ps_fma(auVar160,auVar84,local_500._0_16_);
              auVar184._0_4_ = auVar84._0_4_ * (float)local_5a0._0_4_;
              auVar184._4_4_ = auVar84._4_4_ * (float)local_5a0._0_4_;
              auVar184._8_4_ = auVar84._8_4_ * (float)local_5a0._0_4_;
              auVar184._12_4_ = auVar84._12_4_ * (float)local_5a0._0_4_;
              auVar84 = vdpps_avx(auVar78,auVar84,0x7f);
              fVar246 = auVar84._0_4_;
              auVar161._0_4_ = auVar78._0_4_ * fVar246;
              auVar161._4_4_ = auVar78._4_4_ * fVar246;
              auVar161._8_4_ = auVar78._8_4_ * fVar246;
              auVar161._12_4_ = auVar78._12_4_ * fVar246;
              auVar83 = vsubps_avx(auVar184,auVar161);
              fVar246 = auVar75._0_4_ * (float)local_5b0._0_4_;
              auVar84 = vmaxss_avx(ZEXT416((uint)fVar222),
                                   ZEXT416((uint)((float)local_800._0_4_ * fVar232 * 1.9073486e-06))
                                  );
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar78,auVar27);
              auVar185._0_4_ = fVar231 * auVar83._0_4_ * fVar246;
              auVar185._4_4_ = fVar237 * auVar83._4_4_ * fVar246;
              auVar185._8_4_ = fVar236 * auVar83._8_4_ * fVar246;
              auVar185._12_4_ = fVar244 * auVar83._12_4_ * fVar246;
              auVar257 = ZEXT1664(auVar138);
              auVar75 = vdpps_avx(auVar82,auVar138,0x7f);
              auVar83 = vdivss_avx512f(ZEXT416((uint)fVar222),auVar79);
              auVar79 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar222),auVar84);
              auVar76 = vdpps_avx(_local_6a0,auVar185,0x7f);
              vfmadd213ss_avx512f(auVar77,auVar83,auVar79);
              fVar231 = auVar75._0_4_ + auVar76._0_4_;
              auVar76 = vdpps_avx(local_670,auVar138,0x7f);
              auVar75 = vdpps_avx(_local_6a0,auVar82,0x7f);
              auVar79 = vmulss_avx512f(auVar80,ZEXT416((uint)(fVar233 * -0.5)));
              auVar80 = vmulss_avx512f(auVar80,auVar80);
              auVar80 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar79._0_4_ * auVar80._0_4_)));
              auVar79 = vdpps_avx(_local_6a0,local_670,0x7f);
              auVar77 = vfnmadd231ss_avx512f(auVar75,auVar85,ZEXT416((uint)fVar231));
              auVar81 = vfnmadd231ss_avx512f(auVar79,auVar85,auVar76);
              auVar75 = vpermilps_avx(local_620._0_16_,0xff);
              fVar234 = fVar234 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar78,auVar78,0xff);
              auVar79 = vfmsub213ss_fma(auVar77,auVar80,auVar75);
              fVar233 = auVar81._0_4_ * auVar80._0_4_;
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar231),ZEXT416((uint)fVar233));
              fVar237 = auVar80._0_4_;
              auVar228._0_4_ = fVar233 / fVar237;
              auVar228._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar202._0_4_ = auVar79._0_4_ / fVar237;
              auVar202._4_12_ = auVar79._4_12_;
              auVar79 = vmulss_avx512f(auVar85,auVar228);
              auVar80 = vmulss_avx512f(auVar85,auVar202);
              fVar235 = fVar235 - (auVar79._0_4_ - fVar234 * (auVar76._0_4_ / fVar237));
              auVar197 = ZEXT464((uint)fVar235);
              fVar231 = (float)local_800._0_4_ - (fVar234 * (fVar231 / fVar237) - auVar80._0_4_);
              uVar221 = 0;
              fVar233 = 0.0;
              fVar237 = 0.0;
              auVar76 = vandps_avx512vl(auVar85,auVar252);
              auVar76 = vucomiss_avx512f(auVar76);
              bVar68 = true;
              if (!(bool)uVar67 && !(bool)uVar69) {
                auVar76 = vaddss_avx512f(auVar84,auVar76);
                auVar79 = vfmadd231ss_fma(auVar76,local_5f0,ZEXT416(0x36000000));
                auVar76 = vandps_avx(auVar252,ZEXT416((uint)fVar234));
                if (auVar76._0_4_ < auVar79._0_4_) {
                  fVar231 = fVar231 + (float)local_5e0._0_4_;
                  uVar221 = 0;
                  fVar233 = 0.0;
                  fVar237 = 0.0;
                  if ((((fVar132 <= fVar231) &&
                       (fVar234 = *(float *)(ray + k * 4 + 0x80), fVar231 <= fVar234)) &&
                      (0.0 <= fVar235)) && (fVar235 <= 1.0)) {
                    auVar50._12_4_ = 0;
                    auVar50._0_12_ = ZEXT812(0);
                    auVar76 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)local_820._0_4_));
                    fVar236 = auVar76._0_4_;
                    pGVar3 = (context->scene->geometries).items[local_6f8].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar64 = true;
                      }
                      else {
                        fVar236 = fVar236 * 1.5 +
                                  local_820._0_4_ * -0.5 * fVar236 * fVar236 * fVar236;
                        auVar162._0_4_ = local_6a0._0_4_ * fVar236;
                        auVar162._4_4_ = local_6a0._4_4_ * fVar236;
                        auVar162._8_4_ = local_6a0._8_4_ * fVar236;
                        auVar162._12_4_ = local_6a0._12_4_ * fVar236;
                        auVar79 = vfmadd213ps_fma(auVar75,auVar162,auVar78);
                        auVar76 = vshufps_avx(auVar162,auVar162,0xc9);
                        auVar75 = vshufps_avx(auVar78,auVar78,0xc9);
                        auVar163._0_4_ = auVar162._0_4_ * auVar75._0_4_;
                        auVar163._4_4_ = auVar162._4_4_ * auVar75._4_4_;
                        auVar163._8_4_ = auVar162._8_4_ * auVar75._8_4_;
                        auVar163._12_4_ = auVar162._12_4_ * auVar75._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar163,auVar78,auVar76);
                        auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                        auVar75 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                        auVar140._0_4_ = auVar79._0_4_ * auVar78._0_4_;
                        auVar140._4_4_ = auVar79._4_4_ * auVar78._4_4_;
                        auVar140._8_4_ = auVar79._8_4_ * auVar78._8_4_;
                        auVar140._12_4_ = auVar79._12_4_ * auVar78._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar140,auVar76,auVar75);
                        local_460 = (RTCHitN  [16])vshufps_avx(auVar76,auVar76,0x55);
                        auStack_450 = vshufps_avx(auVar76,auVar76,0xaa);
                        local_440 = auVar76._0_4_;
                        uStack_43c = local_440;
                        uStack_438 = local_440;
                        uStack_434 = local_440;
                        local_430 = fVar235;
                        fStack_42c = fVar235;
                        fStack_428 = fVar235;
                        fStack_424 = fVar235;
                        local_420 = ZEXT416(0) << 0x20;
                        local_410 = local_470._0_8_;
                        uStack_408 = local_470._8_8_;
                        local_400 = local_480;
                        vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                        uStack_3ec = context->user->instID[0];
                        local_3f0 = uStack_3ec;
                        uStack_3e8 = uStack_3ec;
                        uStack_3e4 = uStack_3ec;
                        uStack_3e0 = context->user->instPrimID[0];
                        uStack_3dc = uStack_3e0;
                        uStack_3d8 = uStack_3e0;
                        uStack_3d4 = uStack_3e0;
                        *(float *)(ray + k * 4 + 0x80) = fVar231;
                        local_910 = local_490._0_8_;
                        uStack_908 = local_490._8_8_;
                        local_6f0.valid = (int *)&local_910;
                        local_6f0.geometryUserPtr = pGVar3->userPtr;
                        local_6f0.context = context->user;
                        local_6f0.hit = local_460;
                        local_6f0.N = 4;
                        _local_800 = ZEXT416((uint)fVar231);
                        local_6f0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar257 = ZEXT1664(auVar138);
                          (*pGVar3->occlusionFilterN)(&local_6f0);
                          auVar197 = ZEXT1664(ZEXT416((uint)fVar235));
                          auVar268 = ZEXT3264(local_7e0);
                          auVar258 = ZEXT3264(local_7c0);
                          auVar270 = ZEXT3264(local_7a0);
                          auVar265 = ZEXT3264(local_8e0);
                          auVar264 = ZEXT3264(local_8c0);
                          auVar263 = ZEXT3264(local_780);
                          auVar262 = ZEXT3264(local_760);
                          auVar261 = ZEXT3264(local_740);
                          auVar260 = ZEXT3264(local_8a0);
                          auVar259 = ZEXT3264(local_880);
                          auVar267 = ZEXT3264(local_860);
                          auVar266 = ZEXT3264(local_840);
                          auVar252._8_4_ = 0x7fffffff;
                          auVar252._0_8_ = 0x7fffffff7fffffff;
                          auVar252._12_4_ = 0x7fffffff;
                          fVar231 = (float)local_800._0_4_;
                          uVar221 = local_800._4_4_;
                          fVar233 = fStack_7f8;
                          fVar237 = fStack_7f4;
                        }
                        auVar52._8_8_ = uStack_908;
                        auVar52._0_8_ = local_910;
                        uVar70 = vptestmd_avx512vl(auVar52,auVar52);
                        if ((uVar70 & 0xf) == 0) {
                          bVar64 = false;
                        }
                        else {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar257 = ZEXT1664(auVar257._0_16_);
                            (*p_Var7)(&local_6f0);
                            auVar197 = ZEXT1664(ZEXT416((uint)fVar235));
                            auVar268 = ZEXT3264(local_7e0);
                            auVar258 = ZEXT3264(local_7c0);
                            auVar270 = ZEXT3264(local_7a0);
                            auVar265 = ZEXT3264(local_8e0);
                            auVar264 = ZEXT3264(local_8c0);
                            auVar263 = ZEXT3264(local_780);
                            auVar262 = ZEXT3264(local_760);
                            auVar261 = ZEXT3264(local_740);
                            auVar260 = ZEXT3264(local_8a0);
                            auVar259 = ZEXT3264(local_880);
                            auVar267 = ZEXT3264(local_860);
                            auVar266 = ZEXT3264(local_840);
                            auVar252._8_4_ = 0x7fffffff;
                            auVar252._0_8_ = 0x7fffffff7fffffff;
                            auVar252._12_4_ = 0x7fffffff;
                            fVar231 = (float)local_800._0_4_;
                            uVar221 = local_800._4_4_;
                            fVar233 = fStack_7f8;
                            fVar237 = fStack_7f4;
                          }
                          auVar53._8_8_ = uStack_908;
                          auVar53._0_8_ = local_910;
                          uVar70 = vptestmd_avx512vl(auVar53,auVar53);
                          uVar70 = uVar70 & 0xf;
                          auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar68 = (bool)((byte)uVar70 & 1);
                          bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar10 = SUB81(uVar70 >> 3,0);
                          *(uint *)(local_6f0.ray + 0x80) =
                               (uint)bVar68 * auVar76._0_4_ |
                               (uint)!bVar68 * *(int *)(local_6f0.ray + 0x80);
                          *(uint *)(local_6f0.ray + 0x84) =
                               (uint)bVar8 * auVar76._4_4_ |
                               (uint)!bVar8 * *(int *)(local_6f0.ray + 0x84);
                          *(uint *)(local_6f0.ray + 0x88) =
                               (uint)bVar9 * auVar76._8_4_ |
                               (uint)!bVar9 * *(int *)(local_6f0.ray + 0x88);
                          *(uint *)(local_6f0.ray + 0x8c) =
                               (uint)bVar10 * auVar76._12_4_ |
                               (uint)!bVar10 * *(int *)(local_6f0.ray + 0x8c);
                          bVar64 = (byte)uVar70 != 0;
                        }
                        if ((bool)bVar64 == false) {
                          *(float *)(ray + k * 4 + 0x80) = fVar234;
                        }
                      }
                      bVar68 = false;
                      goto LAB_01bfe29e;
                    }
                  }
                  bVar68 = false;
                  bVar64 = 0;
                }
              }
LAB_01bfe29e:
              if (!bVar68) goto LAB_01bfe664;
              lVar66 = lVar66 + -1;
            } while (lVar66 != 0);
            bVar64 = 0;
LAB_01bfe664:
            bVar63 = bVar63 | bVar64 & 1;
            auVar56._4_4_ = fStack_33c;
            auVar56._0_4_ = local_340;
            auVar56._8_4_ = fStack_338;
            auVar56._12_4_ = fStack_334;
            auVar56._16_4_ = fStack_330;
            auVar56._20_4_ = fStack_32c;
            auVar56._24_4_ = fStack_328;
            auVar56._28_4_ = fStack_324;
            uVar221 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar36._4_4_ = uVar221;
            auVar36._0_4_ = uVar221;
            auVar36._8_4_ = uVar221;
            auVar36._12_4_ = uVar221;
            auVar36._16_4_ = uVar221;
            auVar36._20_4_ = uVar221;
            auVar36._24_4_ = uVar221;
            auVar36._28_4_ = uVar221;
            uVar15 = vcmpps_avx512vl(auVar56,auVar36,2);
            bVar61 = bVar59 & bVar61 & (byte)uVar15;
          } while (bVar61 != 0);
        }
        auVar151._0_4_ = (float)local_6c0._0_4_ + (float)local_360._0_4_;
        auVar151._4_4_ = (float)local_6c0._4_4_ + (float)local_360._4_4_;
        auVar151._8_4_ = fStack_6b8 + fStack_358;
        auVar151._12_4_ = fStack_6b4 + fStack_354;
        auVar151._16_4_ = fStack_6b0 + fStack_350;
        auVar151._20_4_ = fStack_6ac + fStack_34c;
        auVar151._24_4_ = fStack_6a8 + fStack_348;
        auVar151._28_4_ = fStack_6a4 + fStack_344;
        uVar221 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar37._4_4_ = uVar221;
        auVar37._0_4_ = uVar221;
        auVar37._8_4_ = uVar221;
        auVar37._12_4_ = uVar221;
        auVar37._16_4_ = uVar221;
        auVar37._20_4_ = uVar221;
        auVar37._24_4_ = uVar221;
        auVar37._28_4_ = uVar221;
        uVar15 = vcmpps_avx512vl(auVar151,auVar37,2);
        bVar64 = (byte)local_8ec | (byte)local_8f4;
        bVar62 = (byte)uVar16 & bVar62 & (byte)uVar15;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar86 = vpblendmd_avx512vl(auVar152,auVar38);
        local_360._0_4_ = (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar68 = (bool)(bVar64 >> 1 & 1);
        local_360._4_4_ = (uint)bVar68 * auVar86._4_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar64 >> 2 & 1);
        fStack_358 = (float)((uint)bVar68 * auVar86._8_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar64 >> 3 & 1);
        fStack_354 = (float)((uint)bVar68 * auVar86._12_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar64 >> 4 & 1);
        fStack_350 = (float)((uint)bVar68 * auVar86._16_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar64 >> 5 & 1);
        fStack_34c = (float)((uint)bVar68 * auVar86._20_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar64 >> 6 & 1);
        fStack_348 = (float)((uint)bVar68 * auVar86._24_4_ | (uint)!bVar68 * 2);
        fStack_344 = (float)((uint)(bVar64 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2);
        uVar15 = vpcmpd_avx512vl(_local_360,local_2c0,2);
        bVar64 = (byte)uVar15 & bVar62;
        if (bVar64 == 0) {
          auVar269 = ZEXT3264(local_640);
          auVar213 = ZEXT3264(local_660);
          fVar222 = (float)local_6c0._0_4_;
          fVar231 = (float)local_6c0._4_4_;
          fVar232 = fStack_6b8;
          fVar233 = fStack_6b4;
          fVar237 = fStack_6b0;
          fVar234 = fStack_6ac;
          fVar235 = fStack_6a8;
          fVar236 = fStack_6a4;
        }
        else {
          auVar75 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar76 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar78 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar79 = vminps_avx(auVar75,auVar78);
          auVar75 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar78 = vmaxps_avx(auVar76,auVar75);
          auVar76 = vandps_avx(auVar252,auVar79);
          auVar75 = vandps_avx(auVar252,auVar78);
          auVar76 = vmaxps_avx(auVar76,auVar75);
          auVar75 = vmovshdup_avx(auVar76);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          fVar244 = auVar76._0_4_ * 1.9073486e-06;
          local_5f0 = vshufps_avx(auVar78,auVar78,0xff);
          _local_4e0 = _local_280;
          local_340 = (float)local_6c0._0_4_ + (float)local_280._0_4_;
          fStack_33c = (float)local_6c0._4_4_ + (float)local_280._4_4_;
          fStack_338 = fStack_6b8 + fStack_278;
          fStack_334 = fStack_6b4 + fStack_274;
          fStack_330 = fStack_6b0 + fStack_270;
          fStack_32c = fStack_6ac + fStack_26c;
          fStack_328 = fStack_6a8 + fStack_268;
          fStack_324 = fStack_6a4 + fStack_264;
          do {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar86 = vblendmps_avx512vl(auVar153,_local_4e0);
            auVar123._0_4_ =
                 (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar68 = (bool)(bVar64 >> 1 & 1);
            auVar123._4_4_ = (uint)bVar68 * auVar86._4_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar64 >> 2 & 1);
            auVar123._8_4_ = (uint)bVar68 * auVar86._8_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar64 >> 3 & 1);
            auVar123._12_4_ = (uint)bVar68 * auVar86._12_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar64 >> 4 & 1);
            auVar123._16_4_ = (uint)bVar68 * auVar86._16_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar64 >> 5 & 1);
            auVar123._20_4_ = (uint)bVar68 * auVar86._20_4_ | (uint)!bVar68 * 0x7f800000;
            auVar123._24_4_ =
                 (uint)(bVar64 >> 6) * auVar86._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
            auVar123._28_4_ = 0x7f800000;
            auVar86 = vshufps_avx(auVar123,auVar123,0xb1);
            auVar86 = vminps_avx(auVar123,auVar86);
            auVar87 = vshufpd_avx(auVar86,auVar86,5);
            auVar86 = vminps_avx(auVar86,auVar87);
            auVar87 = vpermpd_avx2(auVar86,0x4e);
            auVar86 = vminps_avx(auVar86,auVar87);
            uVar15 = vcmpps_avx512vl(auVar123,auVar86,0);
            bVar59 = (byte)uVar15 & bVar64;
            bVar61 = bVar64;
            if (bVar59 != 0) {
              bVar61 = bVar59;
            }
            iVar18 = 0;
            for (uVar71 = (uint)bVar61; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            bVar61 = '\x01' << ((byte)iVar18 & 0x1f);
            fVar246 = *(float *)(local_260 + (uint)(iVar18 << 2));
            fVar248 = local_8e4;
            fVar247 = *(float *)(local_320 + (uint)(iVar18 << 2));
            uVar221 = 0;
            uVar254 = 0;
            uVar255 = 0;
            if ((float)local_680._0_4_ < 0.0) {
              local_820._0_16_ = ZEXT416((uint)*(float *)(local_320 + (uint)(iVar18 << 2)));
              fVar248 = sqrtf((float)local_680._0_4_);
              fVar247 = (float)local_820._0_4_;
              uVar221 = local_820._4_4_;
              uVar254 = local_820._8_4_;
              uVar255 = local_820._12_4_;
            }
            bVar59 = ~bVar61;
            lVar66 = 5;
            do {
              auVar86 = local_820;
              auVar141._4_4_ = fVar246;
              auVar141._0_4_ = fVar246;
              auVar141._8_4_ = fVar246;
              auVar141._12_4_ = fVar246;
              auVar75 = vfmadd132ps_fma(auVar141,ZEXT816(0) << 0x40,local_670);
              fVar222 = 1.0 - fVar247;
              auVar186._0_4_ = local_540._0_4_ * fVar247;
              auVar186._4_4_ = local_540._4_4_ * fVar247;
              auVar186._8_4_ = local_540._8_4_ * fVar247;
              auVar186._12_4_ = local_540._12_4_ * fVar247;
              local_4c0._0_16_ = ZEXT416((uint)fVar222);
              auVar203._4_4_ = fVar222;
              auVar203._0_4_ = fVar222;
              auVar203._8_4_ = fVar222;
              auVar203._12_4_ = fVar222;
              auVar76 = vfmadd231ps_fma(auVar186,auVar203,local_500._0_16_);
              auVar211._0_4_ = local_520._0_4_ * fVar247;
              auVar211._4_4_ = local_520._4_4_ * fVar247;
              auVar211._8_4_ = local_520._8_4_ * fVar247;
              auVar211._12_4_ = local_520._12_4_ * fVar247;
              auVar78 = vfmadd231ps_fma(auVar211,auVar203,local_540._0_16_);
              auVar219._0_4_ = fVar247 * (float)local_560._0_4_;
              auVar219._4_4_ = fVar247 * (float)local_560._4_4_;
              auVar219._8_4_ = fVar247 * fStack_558;
              auVar219._12_4_ = fVar247 * fStack_554;
              auVar79 = vfmadd231ps_fma(auVar219,auVar203,local_520._0_16_);
              auVar229._0_4_ = fVar247 * auVar78._0_4_;
              auVar229._4_4_ = fVar247 * auVar78._4_4_;
              auVar229._8_4_ = fVar247 * auVar78._8_4_;
              auVar229._12_4_ = fVar247 * auVar78._12_4_;
              auVar76 = vfmadd231ps_fma(auVar229,auVar203,auVar76);
              auVar187._0_4_ = fVar247 * auVar79._0_4_;
              auVar187._4_4_ = fVar247 * auVar79._4_4_;
              auVar187._8_4_ = fVar247 * auVar79._8_4_;
              auVar187._12_4_ = fVar247 * auVar79._12_4_;
              auVar78 = vfmadd231ps_fma(auVar187,auVar203,auVar78);
              auVar212._0_4_ = fVar247 * auVar78._0_4_;
              auVar212._4_4_ = fVar247 * auVar78._4_4_;
              auVar212._8_4_ = fVar247 * auVar78._8_4_;
              auVar212._12_4_ = fVar247 * auVar78._12_4_;
              auVar79 = vfmadd231ps_fma(auVar212,auVar76,auVar203);
              auVar76 = vsubps_avx(auVar78,auVar76);
              auVar28._8_4_ = 0x40400000;
              auVar28._0_8_ = 0x4040000040400000;
              auVar28._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar76,auVar28);
              local_620._0_16_ = auVar79;
              auVar76 = vsubps_avx(auVar75,auVar79);
              _local_6a0 = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              _local_800 = auVar76;
              local_820._4_4_ = uVar221;
              local_820._0_4_ = fVar247;
              local_820._8_4_ = uVar254;
              local_820._16_16_ = auVar86._16_16_;
              local_820._12_4_ = uVar255;
              if (auVar76._0_4_ < 0.0) {
                auVar259._0_4_ = sqrtf(auVar76._0_4_);
                auVar259._4_60_ = extraout_var_01;
                auVar76 = auVar259._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
              }
              local_5a0 = vdpps_avx(auVar78,auVar78,0x7f);
              fVar222 = local_5a0._0_4_;
              auVar188._4_12_ = ZEXT812(0) << 0x20;
              auVar188._0_4_ = fVar222;
              auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              fVar231 = auVar75._0_4_;
              local_5b0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(local_5a0,auVar29);
              auVar75 = vfnmadd213ss_fma(local_5b0,local_5a0,ZEXT416(0x40000000));
              uVar71 = auVar76._0_4_;
              if (fVar222 < auVar79._0_4_) {
                fVar232 = sqrtf(fVar222);
                auVar76 = ZEXT416(uVar71);
              }
              else {
                auVar79 = vsqrtss_avx(local_5a0,local_5a0);
                fVar232 = auVar79._0_4_;
              }
              fVar222 = fVar231 * 1.5 + fVar222 * -0.5 * fVar231 * fVar231 * fVar231;
              local_960 = auVar78._0_4_;
              fStack_95c = auVar78._4_4_;
              fStack_958 = auVar78._8_4_;
              fStack_954 = auVar78._12_4_;
              auVar142._0_4_ = fVar222 * local_960;
              auVar142._4_4_ = fVar222 * fStack_95c;
              auVar142._8_4_ = fVar222 * fStack_958;
              auVar142._12_4_ = fVar222 * fStack_954;
              auVar79 = vdpps_avx(auVar142,_local_6a0,0x7f);
              auVar80 = vaddss_avx512f(auVar76,ZEXT416(0x3f800000));
              fVar231 = auVar79._0_4_;
              auVar143._0_4_ = fVar231 * fVar231;
              auVar143._4_4_ = auVar79._4_4_ * auVar79._4_4_;
              auVar143._8_4_ = auVar79._8_4_ * auVar79._8_4_;
              auVar143._12_4_ = auVar79._12_4_ * auVar79._12_4_;
              auVar85 = vsubps_avx(_local_800,auVar143);
              fVar233 = auVar85._0_4_;
              auVar164._4_12_ = ZEXT812(0) << 0x20;
              auVar164._0_4_ = fVar233;
              auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar164);
              auVar77 = vmulss_avx512f(auVar84,ZEXT416(0x3fc00000));
              uVar69 = fVar233 == 0.0;
              uVar67 = fVar233 < 0.0;
              if ((bool)uVar67) {
                local_5d0 = fVar222;
                fStack_5cc = fVar222;
                fStack_5c8 = fVar222;
                fStack_5c4 = fVar222;
                local_5c0 = auVar84;
                fVar249 = sqrtf(fVar233);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar76 = ZEXT416(uVar71);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar84 = local_5c0;
                fVar222 = local_5d0;
                fVar237 = fStack_5cc;
                fVar234 = fStack_5c8;
                fVar235 = fStack_5c4;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar249 = auVar85._0_4_;
                fVar237 = fVar222;
                fVar234 = fVar222;
                fVar235 = fVar222;
              }
              auVar243._8_4_ = 0x7fffffff;
              auVar243._0_8_ = 0x7fffffff7fffffff;
              auVar243._12_4_ = 0x7fffffff;
              auVar269 = ZEXT3264(local_640);
              auVar266 = ZEXT3264(local_840);
              auVar267 = ZEXT3264(local_860);
              auVar259 = ZEXT3264(local_880);
              auVar260 = ZEXT3264(local_8a0);
              auVar261 = ZEXT3264(local_740);
              auVar262 = ZEXT3264(local_760);
              auVar263 = ZEXT3264(local_780);
              auVar264 = ZEXT3264(local_8c0);
              auVar265 = ZEXT3264(local_8e0);
              auVar257 = ZEXT3264(local_7a0);
              auVar268 = ZEXT3264(local_7e0);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,
                                        local_4c0._0_16_);
              fVar236 = auVar85._0_4_ * 6.0;
              fVar247 = local_820._0_4_ * 6.0;
              auVar189._0_4_ = fVar247 * (float)local_560._0_4_;
              auVar189._4_4_ = fVar247 * (float)local_560._4_4_;
              auVar189._8_4_ = fVar247 * fStack_558;
              auVar189._12_4_ = fVar247 * fStack_554;
              auVar165._4_4_ = fVar236;
              auVar165._0_4_ = fVar236;
              auVar165._8_4_ = fVar236;
              auVar165._12_4_ = fVar236;
              auVar85 = vfmadd132ps_fma(auVar165,auVar189,local_520._0_16_);
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4c0._0_16_,
                                        local_820._0_16_);
              fVar236 = auVar81._0_4_ * 6.0;
              auVar190._4_4_ = fVar236;
              auVar190._0_4_ = fVar236;
              auVar190._8_4_ = fVar236;
              auVar190._12_4_ = fVar236;
              auVar85 = vfmadd132ps_fma(auVar190,auVar85,local_540._0_16_);
              fVar236 = local_4c0._0_4_ * 6.0;
              auVar166._4_4_ = fVar236;
              auVar166._0_4_ = fVar236;
              auVar166._8_4_ = fVar236;
              auVar166._12_4_ = fVar236;
              auVar85 = vfmadd132ps_fma(auVar166,auVar85,local_500._0_16_);
              auVar191._0_4_ = auVar85._0_4_ * (float)local_5a0._0_4_;
              auVar191._4_4_ = auVar85._4_4_ * (float)local_5a0._0_4_;
              auVar191._8_4_ = auVar85._8_4_ * (float)local_5a0._0_4_;
              auVar191._12_4_ = auVar85._12_4_ * (float)local_5a0._0_4_;
              auVar85 = vdpps_avx(auVar78,auVar85,0x7f);
              fVar236 = auVar85._0_4_;
              auVar167._0_4_ = local_960 * fVar236;
              auVar167._4_4_ = fStack_95c * fVar236;
              auVar167._8_4_ = fStack_958 * fVar236;
              auVar167._12_4_ = fStack_954 * fVar236;
              auVar85 = vsubps_avx(auVar191,auVar167);
              fVar236 = auVar75._0_4_ * (float)local_5b0._0_4_;
              auVar81 = vmaxss_avx(ZEXT416((uint)fVar244),
                                   ZEXT416((uint)(fVar246 * fVar248 * 1.9073486e-06)));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar83 = vxorps_avx512vl(auVar78,auVar30);
              auVar192._0_4_ = fVar222 * auVar85._0_4_ * fVar236;
              auVar192._4_4_ = fVar237 * auVar85._4_4_ * fVar236;
              auVar192._8_4_ = fVar234 * auVar85._8_4_ * fVar236;
              auVar192._12_4_ = fVar235 * auVar85._12_4_ * fVar236;
              auVar75 = vdpps_avx(auVar83,auVar142,0x7f);
              auVar85 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar244),auVar81);
              auVar76 = vdpps_avx(_local_6a0,auVar192,0x7f);
              vfmadd213ss_avx512f(auVar80,ZEXT416((uint)(fVar244 / fVar232)),auVar85);
              fVar222 = auVar75._0_4_ + auVar76._0_4_;
              auVar76 = vdpps_avx(local_670,auVar142,0x7f);
              auVar75 = vdpps_avx(_local_6a0,auVar83,0x7f);
              auVar85 = vmulss_avx512f(auVar84,ZEXT416((uint)(fVar233 * -0.5)));
              auVar84 = vmulss_avx512f(auVar84,auVar84);
              auVar77 = vaddss_avx512f(auVar77,ZEXT416((uint)(auVar85._0_4_ * auVar84._0_4_)));
              auVar85 = vdpps_avx(_local_6a0,local_670,0x7f);
              auVar84 = vfnmadd231ss_fma(auVar75,auVar79,ZEXT416((uint)fVar222));
              auVar80 = vfnmadd231ss_fma(auVar85,auVar79,auVar76);
              auVar75 = vpermilps_avx(local_620._0_16_,0xff);
              fVar249 = fVar249 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar78,auVar78,0xff);
              auVar85 = vfmsub213ss_fma(auVar84,auVar77,auVar75);
              fVar232 = auVar80._0_4_ * auVar77._0_4_;
              auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar222),ZEXT416((uint)fVar232));
              fVar233 = auVar84._0_4_;
              fVar247 = local_820._0_4_ -
                        (fVar231 * (fVar232 / fVar233) - fVar249 * (auVar76._0_4_ / fVar233));
              uVar221 = 0;
              uVar254 = 0;
              uVar255 = 0;
              fVar246 = fVar246 - (fVar249 * (fVar222 / fVar233) -
                                  fVar231 * (auVar85._0_4_ / fVar233));
              auVar76 = vandps_avx(auVar79,auVar243);
              auVar76 = vucomiss_avx512f(auVar76);
              bVar68 = true;
              fVar222 = (float)local_6c0._0_4_;
              fVar231 = (float)local_6c0._4_4_;
              fVar232 = fStack_6b8;
              fVar233 = fStack_6b4;
              fVar237 = fStack_6b0;
              fVar234 = fStack_6ac;
              fVar235 = fStack_6a8;
              fVar236 = fStack_6a4;
              if ((bool)uVar67 || (bool)uVar69) {
LAB_01bfeda5:
                auVar213 = ZEXT3264(local_660);
                auVar270 = ZEXT3264(local_7a0);
                auVar258 = ZEXT3264(local_7c0);
              }
              else {
                auVar76 = vaddss_avx512f(auVar81,auVar76);
                auVar79 = vfmadd231ss_fma(auVar76,local_5f0,ZEXT416(0x36000000));
                auVar76 = vandps_avx(auVar243,ZEXT416((uint)fVar249));
                auVar213 = ZEXT3264(local_660);
                auVar270 = ZEXT3264(local_7a0);
                if (auVar79._0_4_ <= auVar76._0_4_) goto LAB_01bfeda5;
                fVar246 = fVar246 + (float)local_5e0._0_4_;
                auVar258 = ZEXT3264(local_7c0);
                if ((((fVar246 < fVar132) ||
                     (fVar249 = *(float *)(ray + k * 4 + 0x80), fVar249 < fVar246)) ||
                    (fVar247 < 0.0)) || (1.0 < fVar247)) {
LAB_01bfed91:
                  bVar68 = false;
                  bVar61 = 0;
                }
                else {
                  auVar51._12_4_ = 0;
                  auVar51._0_12_ = ZEXT812(0);
                  auVar76 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)local_800._0_4_));
                  fVar250 = auVar76._0_4_;
                  pGVar3 = (context->scene->geometries).items[local_6f8].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01bfed91;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar61 = true;
                  }
                  else {
                    fVar250 = fVar250 * 1.5 +
                              (float)local_800._0_4_ * -0.5 * fVar250 * fVar250 * fVar250;
                    auVar168._0_4_ = fVar250 * (float)local_6a0._0_4_;
                    auVar168._4_4_ = fVar250 * (float)local_6a0._4_4_;
                    auVar168._8_4_ = fVar250 * fStack_698;
                    auVar168._12_4_ = fVar250 * fStack_694;
                    auVar79 = vfmadd213ps_fma(auVar75,auVar168,auVar78);
                    auVar76 = vshufps_avx(auVar168,auVar168,0xc9);
                    auVar75 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar169._0_4_ = auVar168._0_4_ * auVar75._0_4_;
                    auVar169._4_4_ = auVar168._4_4_ * auVar75._4_4_;
                    auVar169._8_4_ = auVar168._8_4_ * auVar75._8_4_;
                    auVar169._12_4_ = auVar168._12_4_ * auVar75._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar169,auVar78,auVar76);
                    auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar75 = vshufps_avx(auVar79,auVar79,0xc9);
                    auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                    auVar144._0_4_ = auVar79._0_4_ * auVar78._0_4_;
                    auVar144._4_4_ = auVar79._4_4_ * auVar78._4_4_;
                    auVar144._8_4_ = auVar79._8_4_ * auVar78._8_4_;
                    auVar144._12_4_ = auVar79._12_4_ * auVar78._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar144,auVar76,auVar75);
                    local_460 = (RTCHitN  [16])vshufps_avx(auVar76,auVar76,0x55);
                    auStack_450 = vshufps_avx(auVar76,auVar76,0xaa);
                    local_440 = auVar76._0_4_;
                    uStack_43c = local_440;
                    uStack_438 = local_440;
                    uStack_434 = local_440;
                    local_430 = fVar247;
                    fStack_42c = fVar247;
                    fStack_428 = fVar247;
                    fStack_424 = fVar247;
                    local_420 = ZEXT416(0) << 0x20;
                    local_410 = local_470._0_8_;
                    uStack_408 = local_470._8_8_;
                    local_400 = local_480;
                    vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                    uStack_3ec = context->user->instID[0];
                    local_3f0 = uStack_3ec;
                    uStack_3e8 = uStack_3ec;
                    uStack_3e4 = uStack_3ec;
                    uStack_3e0 = context->user->instPrimID[0];
                    uStack_3dc = uStack_3e0;
                    uStack_3d8 = uStack_3e0;
                    uStack_3d4 = uStack_3e0;
                    *(float *)(ray + k * 4 + 0x80) = fVar246;
                    local_910 = local_490._0_8_;
                    uStack_908 = local_490._8_8_;
                    local_6f0.valid = (int *)&local_910;
                    local_6f0.geometryUserPtr = pGVar3->userPtr;
                    local_6f0.context = context->user;
                    local_6f0.hit = local_460;
                    local_6f0.N = 4;
                    local_820._0_16_ = ZEXT416((uint)fVar247);
                    local_620._0_4_ = fVar249;
                    local_6f0.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar257 = ZEXT1664(local_7a0._0_16_);
                      (*pGVar3->occlusionFilterN)(&local_6f0);
                      auVar268 = ZEXT3264(local_7e0);
                      auVar258 = ZEXT3264(local_7c0);
                      auVar270 = ZEXT3264(local_7a0);
                      auVar265 = ZEXT3264(local_8e0);
                      auVar264 = ZEXT3264(local_8c0);
                      auVar263 = ZEXT3264(local_780);
                      auVar262 = ZEXT3264(local_760);
                      auVar261 = ZEXT3264(local_740);
                      auVar260 = ZEXT3264(local_8a0);
                      auVar259 = ZEXT3264(local_880);
                      auVar213 = ZEXT3264(local_660);
                      auVar267 = ZEXT3264(local_860);
                      auVar266 = ZEXT3264(local_840);
                      auVar269 = ZEXT3264(local_640);
                      fVar249 = (float)local_620._0_4_;
                      fVar222 = (float)local_6c0._0_4_;
                      fVar231 = (float)local_6c0._4_4_;
                      fVar232 = fStack_6b8;
                      fVar233 = fStack_6b4;
                      fVar237 = fStack_6b0;
                      fVar234 = fStack_6ac;
                      fVar235 = fStack_6a8;
                      fVar236 = fStack_6a4;
                      fVar247 = (float)local_820._0_4_;
                      uVar221 = local_820._4_4_;
                      uVar254 = local_820._8_4_;
                      uVar255 = local_820._12_4_;
                    }
                    auVar54._8_8_ = uStack_908;
                    auVar54._0_8_ = local_910;
                    uVar70 = vptestmd_avx512vl(auVar54,auVar54);
                    if ((uVar70 & 0xf) == 0) {
                      bVar61 = false;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        (*p_Var7)(&local_6f0);
                        auVar268 = ZEXT3264(local_7e0);
                        auVar258 = ZEXT3264(local_7c0);
                        auVar270 = ZEXT3264(local_7a0);
                        auVar265 = ZEXT3264(local_8e0);
                        auVar264 = ZEXT3264(local_8c0);
                        auVar263 = ZEXT3264(local_780);
                        auVar262 = ZEXT3264(local_760);
                        auVar261 = ZEXT3264(local_740);
                        auVar260 = ZEXT3264(local_8a0);
                        auVar259 = ZEXT3264(local_880);
                        auVar213 = ZEXT3264(local_660);
                        auVar267 = ZEXT3264(local_860);
                        auVar266 = ZEXT3264(local_840);
                        auVar269 = ZEXT3264(local_640);
                        fVar249 = (float)local_620._0_4_;
                        fVar222 = (float)local_6c0._0_4_;
                        fVar231 = (float)local_6c0._4_4_;
                        fVar232 = fStack_6b8;
                        fVar233 = fStack_6b4;
                        fVar237 = fStack_6b0;
                        fVar234 = fStack_6ac;
                        fVar235 = fStack_6a8;
                        fVar236 = fStack_6a4;
                        fVar247 = (float)local_820._0_4_;
                        uVar221 = local_820._4_4_;
                        uVar254 = local_820._8_4_;
                        uVar255 = local_820._12_4_;
                      }
                      auVar55._8_8_ = uStack_908;
                      auVar55._0_8_ = local_910;
                      uVar70 = vptestmd_avx512vl(auVar55,auVar55);
                      uVar70 = uVar70 & 0xf;
                      auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar68 = (bool)((byte)uVar70 & 1);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_6f0.ray + 0x80) =
                           (uint)bVar68 * auVar76._0_4_ |
                           (uint)!bVar68 * *(int *)(local_6f0.ray + 0x80);
                      *(uint *)(local_6f0.ray + 0x84) =
                           (uint)bVar8 * auVar76._4_4_ |
                           (uint)!bVar8 * *(int *)(local_6f0.ray + 0x84);
                      *(uint *)(local_6f0.ray + 0x88) =
                           (uint)bVar9 * auVar76._8_4_ |
                           (uint)!bVar9 * *(int *)(local_6f0.ray + 0x88);
                      *(uint *)(local_6f0.ray + 0x8c) =
                           (uint)bVar10 * auVar76._12_4_ |
                           (uint)!bVar10 * *(int *)(local_6f0.ray + 0x8c);
                      bVar61 = (byte)uVar70 != 0;
                    }
                    if ((bool)bVar61 == false) {
                      *(float *)(ray + k * 4 + 0x80) = fVar249;
                    }
                  }
                  bVar68 = false;
                }
              }
              if (!bVar68) goto LAB_01bff1af;
              lVar66 = lVar66 + -1;
            } while (lVar66 != 0);
            bVar61 = 0;
LAB_01bff1af:
            bVar63 = bVar63 | bVar61 & 1;
            auVar57._4_4_ = fStack_33c;
            auVar57._0_4_ = local_340;
            auVar57._8_4_ = fStack_338;
            auVar57._12_4_ = fStack_334;
            auVar57._16_4_ = fStack_330;
            auVar57._20_4_ = fStack_32c;
            auVar57._24_4_ = fStack_328;
            auVar57._28_4_ = fStack_324;
            uVar221 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar39._4_4_ = uVar221;
            auVar39._0_4_ = uVar221;
            auVar39._8_4_ = uVar221;
            auVar39._12_4_ = uVar221;
            auVar39._16_4_ = uVar221;
            auVar39._20_4_ = uVar221;
            auVar39._24_4_ = uVar221;
            auVar39._28_4_ = uVar221;
            uVar15 = vcmpps_avx512vl(auVar57,auVar39,2);
            bVar64 = bVar59 & bVar64 & (byte)uVar15;
          } while (bVar64 != 0);
        }
        uVar16 = vpcmpd_avx512vl(local_2c0,_local_360,1);
        uVar17 = vpcmpd_avx512vl(local_2c0,local_240,1);
        auVar172._0_4_ = fVar222 + (float)local_1c0._0_4_;
        auVar172._4_4_ = fVar231 + (float)local_1c0._4_4_;
        auVar172._8_4_ = fVar232 + fStack_1b8;
        auVar172._12_4_ = fVar233 + fStack_1b4;
        auVar172._16_4_ = fVar237 + fStack_1b0;
        auVar172._20_4_ = fVar234 + fStack_1ac;
        auVar172._24_4_ = fVar235 + fStack_1a8;
        auVar172._28_4_ = fVar236 + fStack_1a4;
        uVar221 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar196._4_4_ = uVar221;
        auVar196._0_4_ = uVar221;
        auVar196._8_4_ = uVar221;
        auVar196._12_4_ = uVar221;
        auVar196._16_4_ = uVar221;
        auVar196._20_4_ = uVar221;
        auVar196._24_4_ = uVar221;
        auVar196._28_4_ = uVar221;
        uVar15 = vcmpps_avx512vl(auVar172,auVar196,2);
        bVar64 = (byte)local_8f0 & (byte)uVar17 & (byte)uVar15;
        auVar204._0_4_ = fVar222 + (float)local_280._0_4_;
        auVar204._4_4_ = fVar231 + (float)local_280._4_4_;
        auVar204._8_4_ = fVar232 + fStack_278;
        auVar204._12_4_ = fVar233 + fStack_274;
        auVar204._16_4_ = fVar237 + fStack_270;
        auVar204._20_4_ = fVar234 + fStack_26c;
        auVar204._24_4_ = fVar235 + fStack_268;
        auVar204._28_4_ = fVar236 + fStack_264;
        uVar15 = vcmpps_avx512vl(auVar204,auVar196,2);
        bVar62 = bVar62 & (byte)uVar16 & (byte)uVar15 | bVar64;
        if (bVar62 == 0) {
          auVar205 = ZEXT3264(_DAT_02020f20);
          auVar197 = ZEXT3264(local_580);
        }
        else {
          uVar70 = local_700 & 0xffffffff;
          abStack_180[uVar70 * 0x60] = bVar62;
          bVar68 = (bool)(bVar64 >> 1 & 1);
          bVar8 = (bool)(bVar64 >> 2 & 1);
          bVar9 = (bool)(bVar64 >> 3 & 1);
          bVar10 = (bool)(bVar64 >> 4 & 1);
          bVar11 = (bool)(bVar64 >> 5 & 1);
          bVar12 = (bool)(bVar64 >> 6 & 1);
          auStack_160[uVar70 * 0x18] =
               (uint)(bVar64 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar64 & 1) * local_280._0_4_;
          auStack_160[uVar70 * 0x18 + 1] =
               (uint)bVar68 * local_1c0._4_4_ | (uint)!bVar68 * local_280._4_4_;
          auStack_160[uVar70 * 0x18 + 2] =
               (uint)bVar8 * (int)fStack_1b8 | (uint)!bVar8 * (int)fStack_278;
          auStack_160[uVar70 * 0x18 + 3] =
               (uint)bVar9 * (int)fStack_1b4 | (uint)!bVar9 * (int)fStack_274;
          auStack_160[uVar70 * 0x18 + 4] =
               (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)fStack_270;
          afStack_140[uVar70 * 0x18 + -3] =
               (float)((uint)bVar11 * (int)fStack_1ac | (uint)!bVar11 * (int)fStack_26c);
          afStack_140[uVar70 * 0x18 + -2] =
               (float)((uint)bVar12 * (int)fStack_1a8 | (uint)!bVar12 * (int)fStack_268);
          afStack_140[uVar70 * 0x18 + -1] =
               (float)((uint)(bVar64 >> 7) * (int)fStack_1a4 |
                      (uint)!(bool)(bVar64 >> 7) * (int)fStack_264);
          uVar15 = vmovlps_avx(local_600);
          *(undefined8 *)(afStack_140 + uVar70 * 0x18) = uVar15;
          auStack_138[uVar70 * 0x18] = (int)local_708 + 1;
          auVar205 = ZEXT3264(_DAT_02020f20);
          auVar197 = ZEXT3264(local_580);
          local_700 = (ulong)((int)local_700 + 1);
        }
      }
    }
    do {
      if ((int)local_700 == 0) {
        if (bVar63 != 0) {
          return local_9bd;
        }
        uVar221 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar31._4_4_ = uVar221;
        auVar31._0_4_ = uVar221;
        auVar31._8_4_ = uVar221;
        auVar31._12_4_ = uVar221;
        uVar15 = vcmpps_avx512vl(local_2d0,auVar31,2);
        uVar71 = (uint)uVar15 & (uint)local_588 - 1 & (uint)local_588;
        local_588 = (ulong)uVar71;
        local_9bd = uVar71 != 0;
        if (!local_9bd) {
          return local_9bd;
        }
        goto LAB_01bfcc6e;
      }
      uVar60 = (ulong)((int)local_700 - 1);
      auVar86 = *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x18);
      auVar173._0_4_ = fVar222 + auVar86._0_4_;
      auVar173._4_4_ = fVar231 + auVar86._4_4_;
      auVar173._8_4_ = fVar232 + auVar86._8_4_;
      auVar173._12_4_ = fVar233 + auVar86._12_4_;
      auVar173._16_4_ = fVar237 + auVar86._16_4_;
      auVar173._20_4_ = fVar234 + auVar86._20_4_;
      auVar173._24_4_ = fVar235 + auVar86._24_4_;
      auVar173._28_4_ = fVar236 + auVar86._28_4_;
      uVar221 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar40._4_4_ = uVar221;
      auVar40._0_4_ = uVar221;
      auVar40._8_4_ = uVar221;
      auVar40._12_4_ = uVar221;
      auVar40._16_4_ = uVar221;
      auVar40._20_4_ = uVar221;
      auVar40._24_4_ = uVar221;
      auVar40._28_4_ = uVar221;
      uVar15 = vcmpps_avx512vl(auVar173,auVar40,2);
      uVar71 = (uint)uVar15 & (uint)abStack_180[uVar60 * 0x60];
      bVar62 = (byte)uVar71;
      uVar70 = uVar60;
      if (uVar71 != 0) {
        auVar174._8_4_ = 0x7f800000;
        auVar174._0_8_ = 0x7f8000007f800000;
        auVar174._12_4_ = 0x7f800000;
        auVar174._16_4_ = 0x7f800000;
        auVar174._20_4_ = 0x7f800000;
        auVar174._24_4_ = 0x7f800000;
        auVar174._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar174,auVar86);
        auVar124._0_4_ =
             (uint)(bVar62 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)auVar86._0_4_;
        bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar68 * auVar87._4_4_ | (uint)!bVar68 * (int)auVar86._4_4_;
        bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar68 * auVar87._8_4_ | (uint)!bVar68 * (int)auVar86._8_4_;
        bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar68 * auVar87._12_4_ | (uint)!bVar68 * (int)auVar86._12_4_;
        bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar124._16_4_ = (uint)bVar68 * auVar87._16_4_ | (uint)!bVar68 * (int)auVar86._16_4_;
        bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar124._20_4_ = (uint)bVar68 * auVar87._20_4_ | (uint)!bVar68 * (int)auVar86._20_4_;
        bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar124._24_4_ = (uint)bVar68 * auVar87._24_4_ | (uint)!bVar68 * (int)auVar86._24_4_;
        auVar124._28_4_ =
             (uVar71 >> 7) * auVar87._28_4_ | (uint)!SUB41(uVar71 >> 7,0) * (int)auVar86._28_4_;
        auVar86 = vshufps_avx(auVar124,auVar124,0xb1);
        auVar86 = vminps_avx(auVar124,auVar86);
        auVar87 = vshufpd_avx(auVar86,auVar86,5);
        auVar86 = vminps_avx(auVar86,auVar87);
        auVar87 = vpermpd_avx2(auVar86,0x4e);
        auVar86 = vminps_avx(auVar86,auVar87);
        uVar15 = vcmpps_avx512vl(auVar124,auVar86,0);
        bVar64 = (byte)uVar15 & bVar62;
        if (bVar64 != 0) {
          uVar71 = (uint)bVar64;
        }
        fVar244 = afStack_140[uVar60 * 0x18 + 1];
        uVar125 = 0;
        for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
          uVar125 = uVar125 + 1;
        }
        local_708 = (ulong)auStack_138[uVar60 * 0x18];
        bVar64 = ~('\x01' << ((byte)uVar125 & 0x1f)) & bVar62;
        abStack_180[uVar60 * 0x60] = bVar64;
        auVar197 = ZEXT3264(local_580);
        if (bVar64 != 0) {
          uVar70 = local_700 & 0xffffffff;
        }
        fVar246 = afStack_140[uVar60 * 0x18];
        auVar175._4_4_ = fVar246;
        auVar175._0_4_ = fVar246;
        auVar175._8_4_ = fVar246;
        auVar175._12_4_ = fVar246;
        auVar175._16_4_ = fVar246;
        auVar175._20_4_ = fVar246;
        auVar175._24_4_ = fVar246;
        auVar175._28_4_ = fVar246;
        fVar244 = fVar244 - fVar246;
        auVar154._4_4_ = fVar244;
        auVar154._0_4_ = fVar244;
        auVar154._8_4_ = fVar244;
        auVar154._12_4_ = fVar244;
        auVar154._16_4_ = fVar244;
        auVar154._20_4_ = fVar244;
        auVar154._24_4_ = fVar244;
        auVar154._28_4_ = fVar244;
        auVar76 = vfmadd132ps_fma(auVar154,auVar175,auVar205._0_32_);
        _local_460 = ZEXT1632(auVar76);
        local_600._8_8_ = 0;
        local_600._0_8_ = *(ulong *)(local_460 + (ulong)uVar125 * 4);
      }
      local_700 = uVar70;
    } while (bVar62 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }